

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O3

void Godunov::ExtrapVelToFacesOnBox
               (Box *bx,int ncomp,Box *xbx,Box *ybx,Box *zbx,Array4<double> *qx,Array4<double> *qy,
               Array4<double> *qz,Array4<const_double> *q,Array4<const_double> *u_ad,
               Array4<const_double> *v_ad,Array4<const_double> *w_ad,Array4<double> *Imx,
               Array4<double> *Imy,Array4<double> *Imz,Array4<double> *Ipx,Array4<double> *Ipy,
               Array4<double> *Ipz,Array4<const_double> *f,Box *domain,Real *dx_arr,Real l_dt,
               BCRec *pbc,bool l_use_forces_in_trans,Real *p)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  double *pdVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  double *pdVar25;
  double *pdVar26;
  double *pdVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  int iVar30;
  int i;
  int iVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  Real *pRVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  double *pdVar75;
  long lVar76;
  int iVar77;
  int iVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  int iVar83;
  int iVar84;
  long lVar85;
  Real *pRVar86;
  long lVar87;
  long lVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  int iVar92;
  long lVar93;
  long lVar94;
  int iVar95;
  double *pdVar96;
  long lVar97;
  long lVar98;
  double *pdVar99;
  int iVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  int iVar104;
  double *pdVar105;
  long lVar106;
  int iVar107;
  long lVar108;
  long lVar109;
  double *pdVar110;
  double *pdVar111;
  long lVar112;
  bool bVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  ulong local_4d8;
  double *local_4d0;
  long local_4c8;
  Real *local_4c0;
  double *local_4b8;
  long local_4b0;
  double *local_4a8;
  double *local_498;
  double *local_490;
  Real *local_488;
  Real *local_480;
  double *local_478;
  double *local_470;
  double *local_468;
  double *local_460;
  double *local_458;
  double *local_450;
  double *local_430;
  long local_420;
  long local_418;
  long local_3c8;
  long local_388;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int aiStack_1ec [2];
  undefined8 uStack_1e4;
  long local_1d8;
  double *local_1d0;
  Box *local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  Real local_188;
  Real local_180;
  Real local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  double *local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  double *local_f0;
  long local_e8;
  double *local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  double *local_b8;
  Box *local_b0;
  Box *local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  Box *local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  Array4<double> *local_50;
  Real local_48;
  
  iVar3 = (domain->smallend).vect[0];
  lVar60 = (long)iVar3;
  iVar4 = (domain->smallend).vect[1];
  lVar61 = (long)iVar4;
  iVar5 = (domain->smallend).vect[2];
  local_180 = *dx_arr;
  local_178 = dx_arr[1];
  local_188 = dx_arr[2];
  iVar92 = (bx->bigend).vect[1];
  uVar6 = (bx->btype).itype;
  iVar59 = iVar92 + 1;
  iVar83 = iVar92;
  if ((uVar6 & 2) == 0) {
    iVar83 = iVar59;
  }
  iVar7 = (domain->bigend).vect[2];
  iVar84 = (domain->bigend).vect[0];
  lVar46 = (long)iVar84;
  iVar8 = (domain->bigend).vect[1];
  lVar33 = (long)iVar8;
  iVar95 = (bx->bigend).vect[2];
  iVar32 = iVar95 + 1;
  iVar100 = iVar95;
  if ((uVar6 & 4) == 0) {
    iVar100 = iVar32;
  }
  iVar92 = iVar92 + 2;
  iVar107 = (bx->bigend).vect[0];
  iVar45 = iVar107 + (~uVar6 & 1) + 1;
  local_d8 = (long)iVar45;
  iVar69 = (bx->smallend).vect[0];
  lVar85 = (long)iVar69;
  iVar45 = iVar45 - iVar69;
  lVar47 = (long)iVar45;
  iVar78 = (bx->smallend).vect[1];
  lVar89 = (long)iVar78;
  iVar70 = iVar78 + -1;
  lVar48 = (long)(iVar92 - iVar70);
  iVar104 = (bx->smallend).vect[2];
  local_158 = (long)iVar104;
  lVar34 = (long)((iVar95 - iVar104) + 3);
  lVar74 = (long)ncomp;
  lVar49 = (long)(iVar107 + 2);
  iVar68 = iVar69 + -1;
  iVar31 = (iVar107 + 2) - iVar68;
  lVar35 = (long)iVar31;
  lVar36 = (long)((iVar83 + 1) - iVar78);
  local_1a0 = (long)((iVar100 - iVar104) + 1);
  local_b8 = Imx->p;
  local_160 = Imx->jstride;
  local_128 = Imx->kstride;
  local_c8 = Imx->nstride;
  local_c0 = (long)(Imx->begin).x;
  local_d0 = (long)(Imx->begin).y;
  local_130 = (long)(Imx->begin).z;
  pdVar18 = q->p;
  lVar19 = q->jstride;
  lVar20 = q->kstride;
  lVar21 = q->nstride;
  uVar9 = (q->begin).x;
  lVar50 = (long)(int)uVar9;
  uVar10 = (q->begin).y;
  lVar51 = (long)(int)uVar10;
  uVar11 = (q->begin).z;
  lVar37 = (long)(int)uVar11;
  local_e0 = Imy->p;
  local_98 = Imy->jstride;
  local_a0 = Imy->kstride;
  local_80 = Imy->nstride;
  local_e8 = (long)(Imy->begin).x;
  local_1a8 = (long)(Imy->begin).y;
  local_138 = (long)(Imy->begin).z;
  local_f0 = Imz->p;
  lVar43 = Imz->jstride;
  local_140 = Imz->kstride;
  local_88 = Imz->nstride;
  local_f8 = (long)(Imz->begin).x;
  local_100 = (long)(Imz->begin).y;
  local_198 = (long)(Imz->begin).z;
  local_1d0 = w_ad->p;
  lVar44 = w_ad->jstride;
  lVar22 = w_ad->kstride;
  local_1d8 = (long)(w_ad->begin).x;
  lVar52 = (long)(w_ad->begin).y;
  iVar95 = (w_ad->begin).z;
  lVar38 = (long)iVar95;
  iVar77 = iVar104 + -1;
  local_150 = Ipx->p;
  pdVar75 = f->p;
  lVar42 = f->jstride;
  local_68 = f->kstride;
  local_90 = (long)(f->begin).x;
  local_1b0 = (long)(f->begin).y;
  local_70 = (long)(f->begin).z;
  pdVar23 = u_ad->p;
  lVar24 = u_ad->jstride;
  local_1c0 = u_ad->kstride;
  local_1b8 = (long)(u_ad->begin).z;
  pdVar25 = Ipy->p;
  pdVar26 = v_ad->p;
  lVar58 = v_ad->jstride;
  local_148 = v_ad->kstride;
  local_170 = (long)(v_ad->begin).x;
  lVar62 = (long)(v_ad->begin).y;
  iVar12 = (v_ad->begin).z;
  pdVar27 = Ipz->p;
  lVar63 = (long)iVar70;
  local_168 = (long)iVar77;
  lVar64 = (long)iVar68;
  if (0 < ncomp) {
    lVar101 = Ipx->jstride;
    lVar56 = Ipx->kstride;
    lVar97 = Ipx->nstride;
    iVar13 = (Ipx->begin).z;
    lVar40 = Ipy->jstride;
    lVar57 = Ipy->kstride;
    iVar14 = (u_ad->begin).y;
    iVar15 = (u_ad->begin).x;
    lVar65 = lVar74 * lVar34;
    lVar66 = Ipy->nstride;
    local_58 = (long)(Ipy->begin).x;
    local_60 = (long)(Ipy->begin).y;
    iVar16 = (Ipy->begin).z;
    dVar117 = l_dt * 0.5;
    lVar108 = lVar47 * lVar48;
    local_4d0 = local_b8 + (((lVar63 - local_d0) * local_160 + lVar85) - local_c0);
    local_118 = (lVar63 - local_1b0) * lVar42;
    local_190 = local_90 * 8;
    local_450 = pdVar75 + ((local_118 + lVar85 + -1) - local_90);
    lVar67 = f->nstride;
    lVar39 = -local_70;
    local_458 = local_150 +
                (((lVar63 - (Ipx->begin).y) * lVar101 + lVar85 + -1) - (long)(Ipx->begin).x);
    lVar93 = Ipz->jstride;
    lVar80 = Ipz->kstride;
    lVar87 = Ipz->nstride;
    local_108 = (long)(Ipz->begin).x;
    local_110 = (long)(Ipz->begin).y;
    iVar17 = (Ipz->begin).z;
    uVar116 = (ulong)(uint)ncomp;
    lVar41 = local_68 * 8;
    local_4d8 = 0;
    local_4c0 = p;
    do {
      if (iVar77 <= iVar32) {
        iVar30 = iVar77;
        do {
          if (iVar70 <= iVar59) {
            lVar53 = (long)iVar30;
            pRVar71 = (Real *)((lVar65 * 8 + local_168 * -8 + lVar53 * 8) * lVar108 +
                              (long)local_4c0);
            pRVar86 = (Real *)((-local_168 + lVar53) * lVar108 * 8 + (long)local_4c0);
            lVar109 = (long)pdVar23 +
                      (lVar53 - local_1b8) * local_1c0 * 8 +
                      lVar85 * 8 + (lVar63 - iVar14) * lVar24 * 8 + (long)iVar15 * -8;
            pdVar105 = (double *)((lVar53 - local_130) * local_128 * 8 + (long)local_4d0);
            pdVar99 = (double *)((lVar39 + lVar53) * lVar41 + (long)local_450);
            pdVar96 = (double *)((lVar53 - iVar13) * lVar56 * 8 + (long)local_458);
            lVar54 = (int)(iVar30 - uVar11) * lVar20;
            lVar53 = lVar63;
            do {
              if (iVar69 <= (int)((~uVar6 & 1) + iVar107)) {
                lVar55 = (lVar53 - lVar51) * lVar19;
                lVar79 = 0;
                do {
                  dVar118 = pdVar96[lVar79];
                  dVar119 = pdVar105[lVar79];
                  if (l_use_forces_in_trans) {
                    dVar118 = dVar118 + pdVar99[lVar79] * dVar117;
                    dVar119 = dVar119 + (pdVar99 + lVar79)[1] * dVar117;
                  }
                  if (lVar60 < lVar85 + lVar79) {
                    if (lVar46 < lVar85 + lVar79) {
                      switch(pbc[local_4d8].bc[3]) {
                      case 1:
                      case 2:
                      case 4:
switchD_003a351f_caseD_1:
                        dVar119 = dVar118;
                        break;
                      case 3:
                        dVar119 = pdVar18[lVar55 + (long)(int)((iVar84 - uVar9) + 1) +
                                                   lVar54 + local_4d8 * lVar21];
                        if (local_4d8 == 0) goto switchD_003a3537_caseD_1;
                        break;
                      case -1:
                        goto switchD_003a351f_caseD_ffffffff;
                      }
                    }
                  }
                  else {
                    switch(pbc[local_4d8].bc[0]) {
                    case 1:
                    case 2:
                    case 4:
switchD_003a3537_caseD_1:
                      dVar118 = dVar119;
                      dVar119 = dVar118;
                      break;
                    case 3:
                      dVar118 = pdVar18[lVar55 + (long)(int)(~uVar9 + iVar3) +
                                                 lVar54 + local_4d8 * lVar21];
                      if (local_4d8 == 0) goto switchD_003a351f_caseD_1;
                      break;
                    case -1:
switchD_003a351f_caseD_ffffffff:
                      dVar119 = 0.0;
                      dVar118 = 0.0;
                    }
                  }
                  dVar121 = *(double *)(lVar109 + lVar79 * 8);
                  pRVar86[lVar79] = dVar118;
                  pRVar71[lVar79] = dVar119;
                  uVar114 = -(ulong)(0.0 <= dVar121);
                  dVar121 = (double)(~-(ulong)(ABS(dVar121) < 1e-08) & 0x3ff0000000000000);
                  pdVar105[lVar79] =
                       dVar121 * (double)(~uVar114 & (ulong)dVar119 | uVar114 & (ulong)dVar118) +
                       (dVar119 + dVar118) * (1.0 - dVar121) * 0.5;
                  lVar79 = lVar79 + 1;
                } while (iVar45 != (int)lVar79);
              }
              lVar53 = lVar53 + 1;
              pRVar71 = pRVar71 + (local_d8 - lVar85);
              pRVar86 = pRVar86 + (local_d8 - lVar85);
              lVar109 = lVar109 + lVar24 * 8;
              pdVar105 = pdVar105 + local_160;
              pdVar99 = pdVar99 + lVar42;
              pdVar96 = pdVar96 + lVar101;
            } while (iVar92 != (int)lVar53);
          }
          bVar113 = iVar30 != iVar32;
          iVar30 = iVar30 + 1;
        } while (bVar113);
      }
      local_4d8 = local_4d8 + 1;
      local_4c0 = local_4c0 + lVar108 * lVar34;
      local_4d0 = local_4d0 + local_c8;
      local_450 = local_450 + lVar67;
      local_458 = local_458 + lVar97;
    } while (local_4d8 != uVar116);
    local_468 = pdVar75 + (((lVar89 - local_1b0) * lVar42 + lVar64) - local_90);
    local_4a8 = pdVar75 + ((((lVar89 + -1) - local_1b0) * lVar42 + lVar64) - local_90);
    local_490 = pdVar18 + (((int)((iVar8 - uVar10) + 1) * lVar19 + lVar64) - lVar50);
    local_450 = pdVar18 + (((int)(~uVar10 + iVar4) * lVar19 + lVar64) - lVar50);
    local_120 = lVar35 * lVar36;
    local_458 = (double *)((lVar108 * 0x10 + local_120 * 8) * lVar65 + (long)p);
    local_480 = p + lVar108 * lVar65 * 2;
    local_4c0 = local_e0 + (((lVar89 - local_1a8) * local_98 + lVar64) - local_e8);
    local_430 = pdVar25 + ((((lVar89 - local_60) + -1) * lVar40 + lVar64) - local_58);
    uVar114 = 0;
    do {
      iVar69 = iVar77;
      if (iVar77 <= iVar32) {
        do {
          if (iVar78 <= iVar83) {
            lVar65 = (long)iVar69;
            lVar101 = (lVar39 + lVar65) * lVar41;
            pdVar96 = (double *)((long)local_468 + lVar101);
            pdVar105 = (double *)(lVar101 + (long)local_4a8);
            lVar56 = (lVar65 - lVar37) * lVar20 * 8;
            lVar101 = (-local_168 + lVar65) * local_120 * 8;
            pRVar71 = (Real *)((long)local_458 + lVar101);
            pRVar86 = (Real *)(lVar101 + (long)local_480);
            lVar97 = (long)pdVar26 +
                     (lVar65 - iVar12) * local_148 * 8 +
                     lVar64 * 8 + (lVar89 - lVar62) * lVar58 * 8 + local_170 * -8;
            pdVar99 = (double *)((lVar65 - local_138) * local_a0 * 8 + (long)local_4c0);
            pdVar110 = (double *)((lVar65 - iVar16) * lVar57 * 8 + (long)local_430);
            lVar101 = lVar89;
            do {
              if (iVar68 <= iVar107 + 1) {
                lVar65 = 0;
                do {
                  dVar118 = pdVar110[lVar65];
                  dVar119 = pdVar99[lVar65];
                  if (l_use_forces_in_trans) {
                    dVar118 = dVar118 + pdVar105[lVar65] * dVar117;
                    dVar119 = dVar119 + pdVar96[lVar65] * dVar117;
                  }
                  if (lVar61 < lVar101) {
                    if (lVar33 < lVar101) {
                      switch(pbc[uVar114].bc[4]) {
                      case 1:
                      case 2:
                      case 4:
switchD_003a3b61_caseD_1:
                        dVar119 = dVar118;
                        dVar118 = dVar119;
                        break;
                      case 3:
                        dVar119 = *(double *)((long)local_490 + lVar65 * 8 + lVar56);
                        if (uVar114 == 1) goto switchD_003a3b8b_caseD_1;
                        break;
                      case -1:
                        goto switchD_003a3b61_caseD_ffffffff;
                      }
                    }
                  }
                  else {
                    switch(pbc[uVar114].bc[1]) {
                    case 1:
                    case 2:
                    case 4:
switchD_003a3b8b_caseD_1:
                      dVar118 = dVar119;
                      break;
                    case 3:
                      dVar118 = *(double *)((long)local_450 + lVar65 * 8 + lVar56);
                      if (uVar114 == 1) goto switchD_003a3b61_caseD_1;
                      break;
                    case -1:
switchD_003a3b61_caseD_ffffffff:
                      dVar119 = 0.0;
                      dVar118 = 0.0;
                    }
                  }
                  dVar121 = *(double *)(lVar97 + lVar65 * 8);
                  pRVar86[lVar65] = dVar118;
                  pRVar71[lVar65] = dVar119;
                  uVar115 = -(ulong)(0.0 <= dVar121);
                  dVar121 = (double)(~-(ulong)(ABS(dVar121) < 1e-08) & 0x3ff0000000000000);
                  pdVar99[lVar65] =
                       dVar121 * (double)(~uVar115 & (ulong)dVar119 | uVar115 & (ulong)dVar118) +
                       (dVar119 + dVar118) * (1.0 - dVar121) * 0.5;
                  lVar65 = lVar65 + 1;
                } while (iVar31 != (int)lVar65);
              }
              lVar101 = lVar101 + 1;
              pdVar96 = pdVar96 + lVar42;
              pdVar105 = pdVar105 + lVar42;
              pRVar71 = pRVar71 + (lVar49 - lVar64);
              pRVar86 = pRVar86 + (lVar49 - lVar64);
              lVar97 = lVar97 + lVar58 * 8;
              pdVar99 = pdVar99 + local_98;
              pdVar110 = pdVar110 + lVar40;
            } while (iVar83 + 1 != (int)lVar101);
          }
          bVar113 = iVar69 != iVar32;
          iVar69 = iVar69 + 1;
        } while (bVar113);
      }
      uVar114 = uVar114 + 1;
      local_468 = local_468 + lVar67;
      local_4a8 = local_4a8 + lVar67;
      local_490 = local_490 + lVar21;
      local_450 = local_450 + lVar21;
      local_458 = local_458 + local_120 * lVar34;
      local_480 = local_480 + local_120 * lVar34;
      local_4c0 = local_4c0 + local_80;
      local_430 = local_430 + lVar66;
    } while (uVar114 != uVar116);
    local_4b8 = pdVar75 + ((local_118 + lVar64) - local_90);
    lVar101 = (lVar63 - lVar51) * lVar19;
    local_468 = pdVar18 + ((lVar64 + lVar101 + (int)((iVar7 - uVar11) + 1) * lVar20) - lVar50);
    local_4a8 = pdVar18 + ((lVar64 + lVar101 + (int)(~uVar11 + iVar5) * lVar20) - lVar50);
    lVar101 = lVar48 * lVar35 * local_1a0;
    lVar56 = (lVar108 * 0x10 + local_120 * 0x10) * lVar34;
    local_490 = (double *)((lVar56 + lVar101 * 8) * lVar74 + (long)p);
    local_488 = (Real *)(lVar56 * lVar74 + (long)p);
    local_470 = local_f0 + (((lVar63 - local_100) * lVar43 + lVar64) - local_f8);
    local_430 = pdVar27 + (((lVar63 - local_110) * lVar93 + lVar64) - local_108);
    local_4d8 = 0;
    do {
      iVar32 = iVar104;
      iVar83 = iVar77;
      if (iVar104 <= iVar100) {
        do {
          if (iVar70 <= iVar59) {
            lVar56 = (long)iVar32;
            pdVar99 = (double *)((lVar39 + lVar56) * lVar41 + (long)local_4b8);
            pdVar111 = (double *)((lVar39 + iVar83) * lVar41 + (long)local_4b8);
            lVar97 = (lVar56 - local_158) * lVar48 * lVar35 * 8;
            pRVar71 = (Real *)((long)local_490 + lVar97);
            pRVar86 = (Real *)(lVar97 + (long)local_488);
            lVar97 = (long)local_1d0 +
                     (lVar56 - lVar38) * lVar22 * 8 +
                     lVar64 * 8 + (lVar63 - lVar52) * lVar44 * 8 + local_1d8 * -8;
            pdVar105 = (double *)((lVar56 - local_198) * local_140 * 8 + (long)local_470);
            pdVar110 = (double *)(((long)iVar83 - (long)iVar17) * lVar80 * 8 + (long)local_430);
            local_460 = local_468;
            lVar56 = lVar63;
            pdVar96 = local_4a8;
            do {
              if (iVar68 <= iVar107 + 1) {
                lVar40 = 0;
                do {
                  dVar118 = pdVar110[lVar40];
                  dVar119 = pdVar105[lVar40];
                  if (l_use_forces_in_trans) {
                    dVar118 = dVar118 + pdVar111[lVar40] * dVar117;
                    dVar119 = dVar119 + pdVar99[lVar40] * dVar117;
                  }
                  if (iVar5 < iVar32) {
                    if (iVar7 < iVar32) {
                      switch(pbc[local_4d8].bc[5]) {
                      case 1:
                      case 2:
                      case 4:
switchD_003a411e_caseD_1:
                        dVar119 = dVar118;
                        dVar118 = dVar119;
                        break;
                      case 3:
                        dVar119 = local_460[lVar40];
                        if (local_4d8 == 2) goto switchD_003a414f_caseD_1;
                        break;
                      case -1:
                        goto switchD_003a411e_caseD_ffffffff;
                      }
                    }
                  }
                  else {
                    switch(pbc[local_4d8].bc[2]) {
                    case 1:
                    case 2:
                    case 4:
switchD_003a414f_caseD_1:
                      dVar118 = dVar119;
                      break;
                    case 3:
                      dVar118 = pdVar96[lVar40];
                      if (local_4d8 == 2) goto switchD_003a411e_caseD_1;
                      break;
                    case -1:
switchD_003a411e_caseD_ffffffff:
                      dVar119 = 0.0;
                      dVar118 = 0.0;
                    }
                  }
                  dVar121 = *(double *)(lVar97 + lVar40 * 8);
                  pRVar86[lVar40] = dVar118;
                  pRVar71[lVar40] = dVar119;
                  uVar114 = -(ulong)(0.0 <= dVar121);
                  dVar121 = (double)(~-(ulong)(ABS(dVar121) < 1e-08) & 0x3ff0000000000000);
                  pdVar105[lVar40] =
                       dVar121 * (double)(~uVar114 & (ulong)dVar119 | uVar114 & (ulong)dVar118) +
                       (dVar119 + dVar118) * (1.0 - dVar121) * 0.5;
                  lVar40 = lVar40 + 1;
                } while (iVar31 != (int)lVar40);
              }
              lVar56 = lVar56 + 1;
              pdVar99 = pdVar99 + lVar42;
              pdVar111 = pdVar111 + lVar42;
              local_460 = local_460 + lVar19;
              pdVar96 = pdVar96 + lVar19;
              pRVar71 = pRVar71 + (lVar49 - lVar64);
              pRVar86 = pRVar86 + (lVar49 - lVar64);
              lVar97 = lVar97 + lVar44 * 8;
              pdVar105 = pdVar105 + lVar43;
              pdVar110 = pdVar110 + lVar93;
            } while (iVar92 != (int)lVar56);
          }
          bVar113 = iVar32 != iVar100;
          iVar32 = iVar32 + 1;
          iVar83 = iVar83 + 1;
        } while (bVar113);
      }
      local_4d8 = local_4d8 + 1;
      local_4b8 = local_4b8 + lVar67;
      local_468 = local_468 + lVar21;
      local_4a8 = local_4a8 + lVar21;
      local_490 = local_490 + lVar101;
      local_488 = local_488 + lVar101;
      local_470 = local_470 + local_88;
      local_430 = local_430 + lVar87;
    } while (local_4d8 != uVar116);
  }
  iVar59 = (bx->smallend).vect[2] + -1;
  iVar92 = (bx->bigend).vect[2] + 1;
  local_1c8 = xbx;
  local_b0 = ybx;
  local_78 = zbx;
  local_50 = qx;
  if (iVar59 <= iVar92) {
    iVar83 = (bx->smallend).vect[1];
    iVar32 = (bx->bigend).vect[1];
    iVar78 = (iVar32 - iVar83) + 3;
    iVar100 = (bx->smallend).vect[0];
    iVar107 = (bx->bigend).vect[0];
    lVar41 = (long)((iVar107 - iVar100) + 3);
    iVar100 = iVar100 + -1;
    iVar107 = iVar107 + 1;
    iVar69 = 0;
    local_a8 = bx;
    local_48 = l_dt;
    do {
      if (iVar83 + -1 <= iVar32 + 1) {
        pdVar96 = (double *)((long)iVar69 * iVar78 * lVar41 * 8 + (long)local_150);
        iVar104 = iVar78;
        do {
          if (iVar100 <= iVar107) {
            memset(pdVar96,0,(ulong)(uint)(iVar107 - iVar100) * 8 + 8);
            l_dt = local_48;
          }
          pdVar96 = pdVar96 + lVar41;
          iVar104 = iVar104 + -1;
        } while (iVar104 != 0);
      }
      iVar69 = iVar69 + 1;
      bVar113 = iVar59 != iVar92;
      iVar59 = iVar59 + 1;
    } while (bVar113);
  }
  uVar28 = *(undefined8 *)(local_1c8->smallend).vect;
  uVar29 = *(undefined8 *)((local_1c8->smallend).vect + 2);
  aiStack_1ec[1] = (int)((ulong)*(undefined8 *)(local_1c8->bigend).vect >> 0x20);
  uStack_1e4 = *(undefined8 *)((local_1c8->bigend).vect + 2);
  iStack_1f0 = (int)uVar29;
  aiStack_1ec[0] = (int)((ulong)uVar29 >> 0x20);
  lVar41 = 0;
  do {
    if ((uStack_1e4._4_4_ >> ((uint)lVar41 & 0x1f) & 1) != 0) {
      aiStack_1ec[lVar41] = aiStack_1ec[lVar41] + -1;
    }
    lVar41 = lVar41 + 1;
  } while (lVar41 != 3);
  local_1f8 = (int)uVar28;
  local_1f8 = local_1f8 + -1;
  iStack_1f4 = (int)((ulong)uVar28 >> 0x20);
  lVar101 = (long)iStack_1f4;
  iVar59 = aiStack_1ec[1] + 1;
  iVar92 = (int)uStack_1e4 + 1;
  iVar83 = (aiStack_1ec[0] + 2) - local_1f8;
  lVar41 = (long)iVar83;
  if (iStack_1f0 <= iVar92) {
    lVar97 = (long)local_1f8;
    dVar117 = -l_dt / (local_178 * 3.0);
    dVar119 = l_dt / (local_178 * 3.0);
    lVar56 = lVar97 * 8;
    lVar40 = lVar56 + lVar50 * -8;
    lVar66 = lVar56 + local_170 * -8;
    lVar57 = -(long)iVar12;
    lVar93 = lVar56 + local_e8 * -8;
    lVar67 = (lVar35 * lVar36 * 0x10 + lVar47 * lVar48 * 0x10) * lVar34;
    iVar32 = iStack_1f0 + -1;
    iVar100 = iStack_1f0;
    do {
      if (iStack_1f4 <= aiStack_1ec[1]) {
        lVar53 = (long)iVar100;
        lVar54 = (long)iVar32;
        lVar80 = (lVar57 + lVar53) * local_148 * 8 + lVar66;
        lVar87 = (lVar57 + lVar54) * local_148 * 8 + lVar66;
        lVar39 = (-local_138 + lVar53) * local_a0 * 8 + lVar93;
        lVar65 = (lVar54 + -local_138) * local_a0 * 8 + lVar93;
        lVar108 = lVar101;
        do {
          if (local_1f8 <= aiStack_1ec[0] + 1) {
            lVar109 = (lVar108 - lVar51) * lVar19 * 8;
            lVar81 = (lVar108 - lVar62) * lVar58 * 8;
            lVar102 = ((lVar108 + 1) - lVar62) * lVar58 * 8;
            lVar103 = (lVar108 - local_1a8) * local_98 * 8;
            lVar106 = ((lVar108 + 1) - local_1a8) * local_98 * 8;
            lVar55 = ((lVar53 - local_158) * lVar48 * 8 + lVar63 * -8 + lVar108 * 8) * lVar35;
            lVar79 = 0;
            do {
              dVar118 = *(double *)((long)pdVar26 + lVar79 * 8 + lVar81 + lVar87);
              dVar121 = *(double *)((long)pdVar26 + lVar79 * 8 + lVar81 + lVar80);
              dVar122 = *(double *)((long)pdVar26 + lVar79 * 8 + lVar102 + lVar87);
              dVar120 = *(double *)((long)pdVar26 + lVar79 * 8 + lVar102 + lVar80);
              dVar118 = *(double *)
                         ((long)p + lVar79 * 8 + lVar55 + lVar67 * lVar74 + lVar97 * 8 + lVar64 * -8
                         ) + (dVar122 - dVar118) *
                             *(double *)
                              ((long)pdVar18 +
                              lVar79 * 8 + lVar109 + (-lVar37 + lVar54) * lVar20 * 8 + lVar40) *
                             dVar119 + (*(double *)((long)local_e0 + lVar79 * 8 + lVar106 + lVar65)
                                        * dVar122 -
                                       *(double *)((long)local_e0 + lVar79 * 8 + lVar103 + lVar65) *
                                       dVar118) * dVar117 + 0.0;
              dVar121 = *(double *)
                         ((long)p +
                         lVar79 * 8 +
                         lVar55 + (lVar67 + lVar48 * lVar35 * local_1a0 * 8) * lVar74 + lVar97 * 8 +
                                  lVar64 * -8) +
                        (dVar120 - dVar121) *
                        *(double *)
                         ((long)pdVar18 +
                         lVar79 * 8 + lVar109 + (-lVar37 + lVar53) * lVar20 * 8 + lVar40) * dVar119
                        + (*(double *)((long)local_e0 + lVar79 * 8 + lVar106 + lVar39) * dVar120 -
                          *(double *)((long)local_e0 + lVar79 * 8 + lVar103 + lVar39) * dVar121) *
                          dVar117 + 0.0;
              if (iVar5 < iVar100) {
                if (iVar7 < iVar100) {
                  switch(pbc->bc[5]) {
                  case 0:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    dVar121 = dVar118;
                    break;
                  case 3:
                    dVar121 = *(double *)
                               ((long)pdVar18 +
                               lVar79 * 8 +
                               lVar109 + lVar56 + (int)((iVar7 - uVar11) + 1) * lVar20 * 8 +
                                         lVar50 * -8);
                    break;
                  case -1:
                    dVar118 = 0.0;
                    dVar121 = 0.0;
                    break;
                  default:
                    goto switchD_003a4b70_default;
                  }
                }
              }
              else {
                switch(pbc->bc[2]) {
                case 1:
                case 2:
                case 4:
                  dVar118 = dVar121;
                  break;
                case 3:
                  dVar118 = *(double *)
                             ((long)pdVar18 +
                             lVar79 * 8 +
                             lVar109 + lVar56 + (int)(~uVar11 + iVar5) * lVar20 * 8 + lVar50 * -8);
                  break;
                case -1:
                  dVar118 = 0.0;
                  dVar121 = 0.0;
                }
              }
switchD_003a4b70_default:
              dVar122 = *(double *)
                         ((long)local_1d0 +
                         lVar79 * 8 +
                         (lVar108 - lVar52) * lVar44 * 8 +
                         (lVar53 - lVar38) * lVar22 * 8 + lVar56 + local_1d8 * -8);
              uVar116 = -(ulong)(0.0 <= dVar122);
              dVar122 = (double)(~-(ulong)(ABS(dVar122) < 1e-08) & 0x3ff0000000000000);
              *(double *)
               ((long)pdVar27 +
               lVar79 * 8 +
               ((lVar53 - iStack_1f0) * (long)(iVar59 - iStack_1f4) * 8 + lVar101 * -8 + lVar108 * 8
               ) * lVar41) = dVar122 * (double)(~uVar116 & (ulong)dVar121 | uVar116 & (ulong)dVar118
                                               ) + (dVar121 + dVar118) * (1.0 - dVar122) * 0.5;
              lVar79 = lVar79 + 1;
            } while (iVar83 != (int)lVar79);
          }
          lVar108 = lVar108 + 1;
        } while (iVar59 != (int)lVar108);
      }
      iVar32 = iVar32 + 1;
      bVar113 = iVar100 != iVar92;
      iVar100 = iVar100 + 1;
    } while (bVar113);
  }
  lVar56 = (long)((aiStack_1ec[1] + 2) - iStack_1f4);
  iVar32 = (int)local_198;
  if (iStack_1f0 <= (int)uStack_1e4) {
    lVar66 = (long)local_1f8;
    lVar97 = lVar66 * 8;
    lVar93 = lVar101 + -1;
    lVar65 = lVar97 + (lVar101 - lVar52) * lVar44 * 8 + local_1d8 * -8;
    lVar39 = lVar97 + (lVar93 - lVar52) * lVar44 * 8 + local_1d8 * -8;
    lVar87 = lVar97 + (lVar101 - local_100) * lVar43 * 8 + local_f8 * -8;
    lVar80 = lVar97 + (lVar93 - local_100) * lVar43 * 8 + local_f8 * -8;
    lVar67 = lVar49 * 8 + lVar64 * -8;
    dVar117 = -l_dt / (local_188 * 3.0);
    dVar119 = l_dt / (local_188 * 3.0);
    lVar40 = lVar44 * 8;
    lVar57 = lVar43 * 8;
    iVar100 = iStack_1f0;
    do {
      if (iStack_1f4 <= iVar59) {
        lVar73 = (long)(int)(iVar100 - uVar11) * lVar20 * 8;
        lVar55 = (long)pdVar26 +
                 (long)(iVar100 - iVar12) * local_148 * 8 +
                 lVar97 + (lVar101 - lVar62) * lVar58 * 8 + local_170 * -8;
        pdVar96 = (double *)((long)(iVar100 - iStack_1f0) * lVar56 * lVar41 * 8 + (long)pdVar25);
        lVar108 = (long)pdVar18 + lVar73 + lVar97 + (lVar101 - lVar51) * lVar19 * 8 + lVar50 * -8;
        lVar90 = (long)pdVar18 + lVar73 + lVar97 + (lVar93 - lVar51) * lVar19 * 8 + lVar50 * -8;
        lVar79 = (long)(iVar100 - iVar95) * lVar22 * 8;
        lVar53 = (long)local_1d0 + lVar79 + lVar65;
        lVar109 = (long)((iVar100 + 1) - iVar95) * lVar22 * 8;
        lVar54 = (long)local_1d0 + lVar109 + lVar65;
        lVar102 = (long)local_1d0 + lVar79 + lVar39;
        lVar79 = (long)local_1d0 + lVar109 + lVar39;
        lVar81 = (long)(iVar100 - iVar32) * local_140 * 8;
        local_4c8 = (long)local_f0 + lVar81 + lVar87;
        lVar109 = (long)((iVar100 + 1) - iVar32) * local_140 * 8;
        lVar106 = (long)local_f0 + lVar81 + lVar80;
        local_4d8 = (long)local_f0 + lVar109 + lVar87;
        lVar81 = (long)local_f0 + lVar109 + lVar80;
        lVar109 = ((long)(iVar100 - iVar77) * lVar36 * 8 + lVar101 * 8 + lVar89 * -8) * lVar35;
        local_498 = (double *)
                    ((long)p +
                    lVar109 + (lVar47 * lVar48 * 0x10 + lVar35 * lVar36 * 8) * lVar74 * lVar34 +
                              lVar66 * 8 + lVar64 * -8);
        lVar103 = (long)p + lVar109 + lVar74 * lVar34 * lVar47 * lVar48 * 0x10 + lVar66 * 8 +
                                      lVar64 * -8;
        lVar109 = lVar101;
        do {
          if (local_1f8 <= aiStack_1ec[0] + 1) {
            lVar72 = 0;
            do {
              dVar118 = *(double *)(lVar102 + lVar72 * 8);
              dVar121 = *(double *)(lVar53 + lVar72 * 8);
              dVar122 = *(double *)(lVar79 + lVar72 * 8);
              dVar120 = *(double *)(lVar54 + lVar72 * 8);
              dVar118 = *(double *)(lVar103 + lVar72 * 8) +
                        (dVar122 - dVar118) * *(double *)(lVar90 + lVar72 * 8) * dVar119 +
                        (*(double *)(lVar81 + lVar72 * 8) * dVar122 -
                        *(double *)(lVar106 + lVar72 * 8) * dVar118) * dVar117 + 0.0;
              dVar121 = *(double *)((long)local_498 + lVar72 * 8) +
                        (dVar120 - dVar121) * *(double *)(lVar108 + lVar72 * 8) * dVar119 +
                        (*(double *)(local_4d8 + lVar72 * 8) * dVar120 -
                        *(double *)(local_4c8 + lVar72 * 8) * dVar121) * dVar117 + 0.0;
              if (lVar61 < lVar109) {
                if (lVar33 < lVar109) {
                  switch(pbc->bc[4]) {
                  case 0:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    dVar121 = dVar118;
                    break;
                  case 3:
                    dVar121 = *(double *)
                               ((long)pdVar18 +
                               lVar72 * 8 +
                               lVar73 + lVar97 + (int)((iVar8 - uVar10) + 1) * lVar19 * 8 +
                                        lVar50 * -8);
                    break;
                  case -1:
                    dVar118 = 0.0;
                    dVar121 = 0.0;
                    break;
                  default:
                    goto switchD_003a5328_default;
                  }
                }
              }
              else {
                switch(pbc->bc[1]) {
                case 1:
                case 2:
                case 4:
                  dVar118 = dVar121;
                  break;
                case 3:
                  dVar118 = *(double *)
                             ((long)pdVar18 +
                             lVar72 * 8 +
                             lVar73 + lVar97 + (int)(~uVar10 + iVar4) * lVar19 * 8 + lVar50 * -8);
                  break;
                case -1:
                  dVar118 = 0.0;
                  dVar121 = 0.0;
                }
              }
switchD_003a5328_default:
              dVar122 = *(double *)(lVar55 + lVar72 * 8);
              uVar116 = -(ulong)(0.0 <= dVar122);
              dVar122 = (double)(~-(ulong)(ABS(dVar122) < 1e-08) & 0x3ff0000000000000);
              pdVar96[lVar72] =
                   dVar122 * (double)(~uVar116 & (ulong)dVar121 | uVar116 & (ulong)dVar118) +
                   (dVar121 + dVar118) * (1.0 - dVar122) * 0.5;
              lVar72 = lVar72 + 1;
            } while (iVar83 != (int)lVar72);
          }
          lVar109 = lVar109 + 1;
          pdVar96 = pdVar96 + ((aiStack_1ec[0] + 2) - lVar66);
          lVar55 = lVar55 + lVar58 * 8;
          lVar108 = lVar108 + lVar19 * 8;
          lVar90 = lVar90 + lVar19 * 8;
          lVar53 = lVar53 + lVar40;
          lVar54 = lVar54 + lVar40;
          lVar102 = lVar102 + lVar40;
          lVar79 = lVar79 + lVar40;
          local_4c8 = local_4c8 + lVar57;
          local_4d8 = local_4d8 + lVar57;
          lVar106 = lVar106 + lVar57;
          lVar81 = lVar81 + lVar57;
          local_498 = (double *)((long)local_498 + lVar67);
          lVar103 = lVar103 + lVar67;
        } while (aiStack_1ec[1] + 2 != (int)lVar109);
      }
      iVar100 = iVar100 + 1;
    } while (iVar100 != iVar92);
  }
  iVar92 = (local_1c8->smallend).vect[2];
  iVar83 = (local_1c8->bigend).vect[2];
  if (iVar92 <= iVar83) {
    lVar40 = local_50->jstride;
    lVar57 = local_50->kstride;
    iVar100 = (local_50->begin).z;
    iVar107 = (local_50->begin).y;
    iVar69 = (local_50->begin).x;
    iVar78 = (local_1c8->bigend).vect[0];
    iVar104 = (local_1c8->bigend).vect[1];
    iVar31 = (local_1c8->smallend).vect[1];
    iVar45 = (local_1c8->smallend).vect[0];
    lVar39 = (long)iVar45;
    pdVar96 = local_50->p;
    lVar97 = lVar39 * 8 + -8;
    lVar93 = lVar97 + local_1d8 * -8;
    lVar97 = lVar97 + (long)local_1f8 * -8;
    lVar87 = lVar39 * 8 + lVar85 * -8;
    dVar119 = (l_dt * -0.25) / local_178;
    dVar117 = (l_dt * -0.25) / local_188;
    lVar80 = (iVar84 + 1) - lVar39;
    lVar66 = (long)(iVar59 - iStack_1f4) * 8;
    lVar67 = lVar101 * -8;
    do {
      if (iVar31 <= iVar104) {
        lVar53 = (long)(iVar92 - iStack_1f0) * lVar56 * 8;
        lVar108 = (iVar92 - iVar12) * local_148 + lVar39;
        lVar65 = (long)iVar31;
        do {
          if (iVar45 <= iVar78) {
            lVar54 = (lVar65 - lVar52) * lVar44 * 8;
            lVar109 = 0;
            do {
              pdVar2 = (double *)
                       ((long)pdVar25 +
                       lVar109 * 8 + (lVar53 + lVar101 * -8 + 8 + lVar65 * 8) * lVar41 + lVar97);
              pdVar99 = (double *)
                        ((long)pdVar25 +
                        lVar109 * 8 + (lVar67 + lVar53 + lVar65 * 8) * lVar41 + lVar97);
              pdVar105 = (double *)
                         ((long)local_1d0 +
                         lVar109 * 8 + lVar54 + (long)((iVar92 + 1) - iVar95) * lVar22 * 8 + lVar93)
              ;
              pdVar110 = (double *)
                         ((long)local_1d0 +
                         lVar109 * 8 + lVar54 + (long)(iVar92 - iVar95) * lVar22 * 8 + lVar93);
              pdVar111 = (double *)
                         ((long)pdVar27 +
                         lVar109 * 8 +
                         (((iVar92 + 1) - iStack_1f0) * lVar66 + lVar67 + lVar65 * 8) * lVar41 +
                         lVar97);
              pdVar1 = (double *)
                       ((long)pdVar27 +
                       lVar109 * 8 +
                       (lVar66 * (iVar92 - iStack_1f0) + lVar67 + lVar65 * 8) * lVar41 + lVar97);
              dVar118 = (*pdVar111 - *pdVar1) * (*pdVar110 + *pdVar105) * dVar117 +
                        *(double *)
                         ((long)p +
                         lVar109 * 8 +
                         ((long)(iVar92 - iVar77) * lVar48 * 8 + lVar63 * -8 + lVar65 * 8) * lVar47
                         + lVar87) +
                        (*pdVar2 - *pdVar99) *
                        (pdVar26[((lVar65 - lVar62) * lVar58 + lVar108 + lVar109 + -1) - local_170]
                        + pdVar26[(((lVar65 + 1) - lVar62) * lVar58 + lVar108 + lVar109 + -1) -
                                  local_170]) * dVar119;
              dVar121 = (pdVar111[1] - pdVar1[1]) * (pdVar110[1] + pdVar105[1]) * dVar117 +
                        *(double *)
                         ((long)p +
                         lVar109 * 8 +
                         ((lVar74 * lVar34 * 8 + local_168 * -8 + (long)iVar92 * 8) * lVar48 +
                          lVar63 * -8 + lVar65 * 8) * lVar47 + lVar87) +
                        (pdVar2[1] - pdVar99[1]) *
                        ((pdVar26 +
                         (((lVar65 - lVar62) * lVar58 + lVar108 + lVar109 + -1) - local_170))[1] +
                        (pdVar26 +
                        ((((lVar65 + 1) - lVar62) * lVar58 + lVar108 + lVar109 + -1) - local_170))
                        [1]) * dVar119;
              if (!l_use_forces_in_trans) {
                dVar118 = dVar118 + pdVar75[((lVar65 - local_1b0) * lVar42 +
                                             (iVar92 - (int)local_70) * local_68 + lVar39 +
                                            lVar109 + -1) - local_90] * l_dt * 0.5;
                dVar121 = dVar121 + (pdVar75 +
                                    (((lVar65 - local_1b0) * lVar42 +
                                      (iVar92 - (int)local_70) * local_68 + lVar39 + lVar109 + -1) -
                                    local_90))[1] * l_dt * 0.5;
              }
              iVar59 = pbc->bc[3];
              dVar122 = dVar121;
              if (lVar60 - lVar39 == lVar109) {
                switch(pbc->bc[0]) {
                case 1:
                  dVar118 = dVar121;
                  break;
                case 2:
                case 4:
                  dVar118 = 0.0;
                  dVar122 = 0.0;
                  if (dVar121 <= 0.0) {
                    dVar118 = dVar121;
                    dVar122 = dVar121;
                  }
                  break;
                case 3:
                  lVar55 = (long)(int)(~uVar9 + iVar3);
LAB_003a5b95:
                  dVar118 = pdVar18[(int)(iVar92 - uVar11) * lVar20 +
                                    (lVar65 - lVar51) * lVar19 + lVar55];
switchD_003a5b77_caseD_1:
                  dVar122 = dVar118;
                  break;
                case -1:
switchD_003a5b3f_caseD_ffffffff:
                  dVar118 = 0.0;
                  dVar122 = 0.0;
                }
              }
              else if (lVar80 == lVar109) {
                switch(iVar59) {
                case 1:
                case 2:
                case 4:
                  goto switchD_003a5b77_caseD_1;
                case 3:
                  lVar55 = (iVar84 + 1) - lVar50;
                  goto LAB_003a5b95;
                case -1:
                  goto switchD_003a5b3f_caseD_ffffffff;
                }
              }
              dVar121 = dVar118;
              if ((lVar80 == lVar109) &&
                 (((iVar59 == 4 || (iVar59 == 2)) && (dVar121 = 0.0, dVar122 = 0.0, 0.0 <= dVar118))
                 )) {
                dVar121 = dVar118;
                dVar122 = dVar118;
              }
              if (((dVar121 <= 0.0) && (0.0 <= dVar122)) || (ABS(dVar122 + dVar121) < 1e-08)) {
                uVar116 = 0;
              }
              else {
                uVar116 = -(ulong)(0.0 <= dVar122 + dVar121);
                uVar116 = ~uVar116 & (ulong)dVar122 | (ulong)dVar121 & uVar116;
              }
              *(ulong *)((long)pdVar96 +
                        lVar109 * 8 +
                        (lVar65 - iVar107) * lVar40 * 8 +
                        (long)(iVar92 - iVar100) * lVar57 * 8 + lVar39 * 8 + (long)iVar69 * -8) =
                   uVar116;
              lVar109 = lVar109 + 1;
            } while ((iVar78 - iVar45) + 1 != (int)lVar109);
          }
          lVar65 = lVar65 + 1;
        } while (iVar104 + 1 != (int)lVar65);
      }
      iVar92 = iVar92 + 1;
    } while (iVar92 != iVar83 + 1);
  }
  uVar28 = *(undefined8 *)(local_b0->smallend).vect;
  uVar29 = *(undefined8 *)((local_b0->smallend).vect + 2);
  aiStack_1ec[1] = (int)((ulong)*(undefined8 *)(local_b0->bigend).vect >> 0x20);
  uStack_1e4 = *(undefined8 *)((local_b0->bigend).vect + 2);
  iStack_1f0 = (int)uVar29;
  aiStack_1ec[0] = (int)((ulong)uVar29 >> 0x20);
  lVar42 = 0;
  do {
    if ((uStack_1e4._4_4_ >> ((uint)lVar42 & 0x1f) & 1) != 0) {
      aiStack_1ec[lVar42] = aiStack_1ec[lVar42] + -1;
    }
    lVar42 = lVar42 + 1;
  } while (lVar42 != 3);
  iStack_1f4 = (int)((ulong)uVar28 >> 0x20);
  iStack_1f4 = iStack_1f4 + -1;
  local_1f8 = (int)uVar28;
  lVar41 = (long)local_1f8;
  iVar92 = aiStack_1ec[0] + 2;
  iVar100 = aiStack_1ec[1] + 2;
  iVar59 = (int)uStack_1e4 + 1;
  lVar42 = (long)(iVar92 - local_1f8);
  lVar58 = (long)(iVar100 - iStack_1f4);
  iVar83 = aiStack_1ec[0] + 1;
  lVar101 = (long)(u_ad->begin).x;
  lVar62 = (long)(u_ad->begin).y;
  if (iStack_1f0 <= (int)uStack_1e4) {
    lVar66 = (long)iStack_1f4;
    dVar117 = -l_dt / (local_188 * 3.0);
    dVar119 = l_dt / (local_188 * 3.0);
    lVar56 = lVar41 * 8;
    lVar97 = local_88 * 8 + (lVar66 - local_100) * lVar43 * 8 + lVar41 * 8 + local_f8 * -8 + -8;
    lVar57 = local_d8 * 8 + lVar85 * -8;
    lVar40 = lVar56 + (lVar66 - lVar52) * lVar44 * 8 + local_1d8 * -8 + -8;
    iVar107 = iStack_1f0;
    do {
      if (iStack_1f4 <= aiStack_1ec[1] + 1) {
        lVar54 = lVar20 * (int)(iVar107 - uVar11);
        lVar39 = (long)pdVar23 +
                 (long)(iVar107 - (int)local_1b8) * local_1c0 * 8 +
                 lVar56 + (lVar66 - lVar62) * lVar24 * 8 + lVar101 * -8;
        pdVar75 = (double *)((long)(iVar107 - iStack_1f0) * lVar42 * lVar58 * 8 + (long)pdVar25);
        lVar108 = (long)pdVar18 +
                  (long)(int)(iVar107 - uVar11) * lVar20 * 8 +
                  lVar21 * 8 + (lVar66 - lVar51) * lVar19 * 8 + lVar41 * 8 + lVar50 * -8 + -8;
        lVar53 = (long)local_1d0 + (long)(iVar107 - iVar95) * lVar22 * 8 + lVar40;
        lVar87 = (long)local_1d0 + (long)((iVar107 + 1) - iVar95) * lVar22 * 8 + lVar40;
        lVar93 = (long)local_f0 + (long)(iVar107 - iVar32) * local_140 * 8 + lVar97;
        lVar80 = (long)local_f0 + (long)((iVar107 + 1) - iVar32) * local_140 * 8 + lVar97;
        lVar65 = (long)p + ((long)(iVar107 - iVar77) * lVar47 * 8 +
                           (local_d8 * 8 + lVar47 * lVar74 * 8 + lVar85 * -8) * lVar34) * lVar48 +
                           lVar56 + (lVar66 - lVar63) * lVar47 * 8 + lVar85 * -8;
        lVar109 = (long)p + ((lVar34 * 8 + local_168 * -8 + (long)iVar107 * 8) * lVar48 +
                            lVar66 * 8 + lVar63 * -8) * lVar47 + lVar56 + lVar85 * -8;
        lVar67 = lVar66;
        do {
          if (local_1f8 <= iVar83) {
            lVar79 = (lVar67 - lVar51) * lVar19;
            lVar55 = 0;
            do {
              pdVar26 = (double *)(lVar80 + lVar55 * 8);
              pdVar96 = (double *)(lVar87 + lVar55 * 8);
              dVar118 = *pdVar96;
              dVar121 = pdVar96[1];
              pdVar96 = (double *)(lVar93 + lVar55 * 8);
              pdVar99 = (double *)(lVar53 + lVar55 * 8);
              dVar122 = *pdVar99;
              dVar120 = pdVar99[1];
              pdVar99 = (double *)(lVar108 + lVar55 * 8);
              dVar118 = *(double *)(lVar109 + lVar55 * 8) +
                        (dVar118 - dVar122) * *pdVar99 * dVar119 +
                        (*pdVar26 * dVar118 - *pdVar96 * dVar122) * dVar117 + 0.0;
              dVar121 = *(double *)(lVar65 + lVar55 * 8) +
                        (dVar121 - dVar120) * pdVar99[1] * dVar119 +
                        (pdVar26[1] * dVar121 - pdVar96[1] * dVar120) * dVar117 + 0.0;
              if (lVar60 < lVar41 + lVar55) {
                if (lVar46 < lVar41 + lVar55) {
                  switch(pbc[1].bc[3]) {
                  case 1:
                  case 2:
                  case 4:
                    dVar121 = dVar118;
                    break;
                  case 3:
                    dVar121 = pdVar18[lVar79 + (long)(int)((iVar84 - uVar9) + 1) + lVar54 + lVar21];
                    break;
                  case -1:
                    goto switchD_003a6347_caseD_ffffffff;
                  }
                }
              }
              else {
                switch(pbc[1].bc[0]) {
                case 1:
                case 2:
                case 4:
                  dVar118 = dVar121;
                  break;
                case 3:
                  dVar118 = pdVar18[lVar79 + (long)(int)(~uVar9 + iVar3) + lVar54 + lVar21];
                  break;
                case -1:
switchD_003a6347_caseD_ffffffff:
                  dVar121 = 0.0;
                  dVar118 = 0.0;
                }
              }
              dVar122 = *(double *)(lVar39 + lVar55 * 8);
              uVar116 = -(ulong)(0.0 <= dVar122);
              dVar122 = (double)(~-(ulong)(ABS(dVar122) < 1e-08) & 0x3ff0000000000000);
              pdVar75[lVar55] =
                   dVar122 * (double)(~uVar116 & (ulong)dVar121 | uVar116 & (ulong)dVar118) +
                   (dVar121 + dVar118) * (1.0 - dVar122) * 0.5;
              lVar55 = lVar55 + 1;
            } while (iVar92 - local_1f8 != (int)lVar55);
          }
          lVar67 = lVar67 + 1;
          pdVar75 = pdVar75 + (iVar92 - lVar41);
          lVar39 = lVar39 + lVar24 * 8;
          lVar108 = lVar108 + lVar19 * 8;
          lVar53 = lVar53 + lVar44 * 8;
          lVar87 = lVar87 + lVar44 * 8;
          lVar93 = lVar93 + lVar43 * 8;
          lVar80 = lVar80 + lVar43 * 8;
          lVar65 = lVar65 + lVar57;
          lVar109 = lVar109 + lVar57;
        } while (iVar100 != (int)lVar67);
      }
      iVar107 = iVar107 + 1;
    } while (iVar107 != iVar59);
  }
  lVar43 = (long)(iVar83 - local_1f8);
  if (iStack_1f0 <= iVar59) {
    lVar57 = (long)iStack_1f4;
    dVar117 = -l_dt / (local_180 * 3.0);
    dVar119 = l_dt / (local_180 * 3.0);
    lVar66 = (lVar57 - lVar51) * lVar19;
    lVar93 = lVar21 * 8 + lVar66 * 8 + lVar41 * 8 + lVar50 * -8;
    lVar67 = (lVar35 * lVar36 * 0x10 + lVar47 * lVar48 * 0x10) * lVar34;
    lVar40 = lVar49 * 8 + lVar64 * -8;
    lVar56 = lVar41 * 8 + (lVar57 - lVar62) * lVar24 * 8 + lVar101 * -8 + 8;
    lVar97 = local_c8 * 8 + (lVar57 - local_d0) * local_160 * 8 + lVar41 * 8 + local_c0 * -8 + 8;
    iVar32 = iStack_1f0 + -1;
    iVar107 = iStack_1f0;
    do {
      if (iStack_1f4 <= aiStack_1ec[1] + 1) {
        lVar80 = (long)iVar107;
        pdVar75 = (double *)((lVar80 - iStack_1f0) * lVar58 * lVar43 * 8 + (long)pdVar27);
        lVar108 = (long)local_1d0 +
                  (lVar80 - lVar38) * lVar22 * 8 +
                  lVar41 * 8 + (lVar57 - lVar52) * lVar44 * 8 + local_1d8 * -8;
        lVar54 = (long)pdVar18 + (-lVar37 + lVar80) * lVar20 * 8 + lVar93;
        lVar87 = (long)iVar32;
        lVar39 = (long)pdVar18 + (-lVar37 + lVar87) * lVar20 * 8 + lVar93;
        lVar65 = (long)pdVar23 + (-local_1b8 + lVar80) * local_1c0 * 8 + lVar56;
        lVar53 = (long)pdVar23 + (-local_1b8 + lVar87) * local_1c0 * 8 + lVar56;
        lVar55 = (long)local_b8 + (-local_130 + lVar80) * local_128 * 8 + lVar97;
        lVar109 = (long)local_b8 + (lVar87 + -local_130) * local_128 * 8 + lVar97;
        lVar87 = ((local_1a0 * 8 + local_158 * -8 + lVar80 * 8) * lVar48 + lVar57 * 8 + lVar63 * -8)
                 * lVar35;
        lVar80 = (long)p + lVar87 + (lVar67 + lVar48 * lVar35 * local_1a0 * 8) * lVar74 + lVar41 * 8
                                    + lVar64 * -8;
        lVar79 = (long)p + lVar87 + lVar67 * lVar74 + lVar41 * 8 + lVar64 * -8;
        lVar87 = lVar57;
        local_498 = pdVar18 + (((int)(~uVar11 + iVar5) * lVar20 + lVar41 + lVar66 + lVar21) - lVar50
                              );
        local_478 = pdVar18 + (((int)((iVar7 - uVar11) + 1) * lVar20 + lVar41 + lVar66 + lVar21) -
                              lVar50);
        do {
          if (local_1f8 <= aiStack_1ec[0]) {
            lVar81 = 0;
            do {
              dVar118 = *(double *)(lVar53 + -8 + lVar81 * 8);
              dVar121 = *(double *)(lVar53 + lVar81 * 8);
              dVar122 = *(double *)(lVar65 + -8 + lVar81 * 8);
              dVar120 = *(double *)(lVar65 + lVar81 * 8);
              dVar118 = *(double *)(lVar79 + lVar81 * 8) +
                        (dVar121 - dVar118) * *(double *)(lVar39 + lVar81 * 8) * dVar119 +
                        (*(double *)(lVar109 + lVar81 * 8) * dVar121 -
                        *(double *)(lVar109 + -8 + lVar81 * 8) * dVar118) * dVar117 + 0.0;
              dVar121 = *(double *)(lVar80 + lVar81 * 8) +
                        (dVar120 - dVar122) * *(double *)(lVar54 + lVar81 * 8) * dVar119 +
                        (*(double *)(lVar55 + lVar81 * 8) * dVar120 -
                        *(double *)(lVar55 + -8 + lVar81 * 8) * dVar122) * dVar117 + 0.0;
              if (iVar5 < iVar107) {
                if (iVar7 < iVar107) {
                  switch(pbc[1].bc[5]) {
                  case 0:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    dVar121 = dVar118;
                    break;
                  case 3:
                    dVar121 = local_478[lVar81];
                    break;
                  case -1:
                    dVar118 = 0.0;
                    dVar121 = 0.0;
                    break;
                  default:
                    goto switchD_003a6af7_default;
                  }
                }
              }
              else {
                switch(pbc[1].bc[2]) {
                case 1:
                case 2:
                case 4:
                  dVar118 = dVar121;
                  break;
                case 3:
                  dVar118 = local_498[lVar81];
                  break;
                case -1:
                  dVar118 = 0.0;
                  dVar121 = 0.0;
                }
              }
switchD_003a6af7_default:
              dVar122 = *(double *)(lVar108 + lVar81 * 8);
              uVar116 = -(ulong)(0.0 <= dVar122);
              dVar122 = (double)(~-(ulong)(ABS(dVar122) < 1e-08) & 0x3ff0000000000000);
              pdVar75[lVar81] =
                   dVar122 * (double)(~uVar116 & (ulong)dVar121 | uVar116 & (ulong)dVar118) +
                   (dVar121 + dVar118) * (1.0 - dVar122) * 0.5;
              lVar81 = lVar81 + 1;
            } while (iVar83 - local_1f8 != (int)lVar81);
          }
          lVar87 = lVar87 + 1;
          pdVar75 = pdVar75 + (iVar83 - lVar41);
          lVar108 = lVar108 + lVar44 * 8;
          local_478 = local_478 + lVar19;
          local_498 = local_498 + lVar19;
          lVar54 = lVar54 + lVar19 * 8;
          lVar39 = lVar39 + lVar19 * 8;
          lVar65 = lVar65 + lVar24 * 8;
          lVar53 = lVar53 + lVar24 * 8;
          lVar55 = lVar55 + local_160 * 8;
          lVar109 = lVar109 + local_160 * 8;
          lVar80 = lVar80 + lVar40;
          lVar79 = lVar79 + lVar40;
        } while (iVar100 != (int)lVar87);
      }
      iVar32 = iVar32 + 1;
      bVar113 = iVar107 != iVar59;
      iVar107 = iVar107 + 1;
    } while (bVar113);
  }
  pdVar75 = f->p;
  lVar38 = f->jstride;
  lVar97 = f->kstride;
  lVar56 = f->nstride;
  lVar40 = (long)(f->begin).x;
  lVar57 = (long)(f->begin).y;
  iVar59 = (f->begin).z;
  iVar32 = (local_b0->smallend).vect[2];
  iVar100 = (local_b0->bigend).vect[2];
  if (iVar32 <= iVar100) {
    iVar107 = (local_b0->smallend).vect[1];
    lVar81 = (long)iVar107;
    iVar69 = (local_b0->smallend).vect[0];
    lVar65 = (long)iVar69;
    lVar93 = lVar65 * 8;
    lVar67 = lVar93 + lVar21 * 8;
    iVar78 = (qy->begin).y;
    lVar87 = qy->jstride;
    iVar104 = (qy->begin).x;
    lVar80 = lVar56 * 8;
    lVar66 = lVar81 + -1;
    lVar55 = lVar93 + (lVar81 - lVar52) * lVar44 * 8 + local_1d8 * -8;
    lVar108 = lVar93 + (lVar66 - lVar52) * lVar44 * 8 + local_1d8 * -8;
    lVar53 = lVar81 * 8 + (long)iStack_1f4 * -8;
    lVar39 = lVar93 + lVar41 * -8;
    lVar54 = (long)iVar83 * 8 + lVar41 * -8;
    lVar41 = (long)iVar92 * 8 + lVar41 * -8;
    lVar109 = lVar35 * lVar36;
    pdVar26 = qy->p;
    lVar79 = lVar49 * 8 + lVar64 * -8;
    lVar52 = qy->kstride;
    iVar92 = (qy->begin).z;
    iVar83 = (local_b0->bigend).vect[0];
    iVar12 = (local_b0->bigend).vect[1];
    dVar119 = (l_dt * -0.25) / local_180;
    dVar117 = (l_dt * -0.25) / local_188;
    lVar44 = lVar44 * 8;
    do {
      if (iVar107 <= iVar12) {
        lVar82 = (long)(iVar32 - (int)local_1b8) * local_1c0 * 8;
        local_4c8 = (long)pdVar26 +
                    (long)(iVar32 - iVar92) * lVar52 * 8 +
                    lVar93 + (lVar81 - iVar78) * lVar87 * 8 + (long)iVar104 * -8;
        lVar102 = (long)(iVar32 - iVar59) * lVar97 * 8;
        lVar106 = (long)(int)(iVar32 - uVar11) * lVar20 * 8;
        local_420 = (long)pdVar18 + lVar106 + lVar67 + (lVar81 - lVar51) * lVar19 * 8 + lVar50 * -8;
        local_3c8 = (long)pdVar75 +
                    lVar102 + lVar80 + (lVar81 - lVar57) * lVar38 * 8 + lVar65 * 8 + lVar40 * -8;
        local_388 = (long)pdVar75 +
                    lVar102 + lVar80 + (lVar66 - lVar57) * lVar38 * 8 + lVar65 * 8 + lVar40 * -8;
        lVar102 = (long)(iVar32 - iVar95) * lVar22 * 8;
        local_418 = (long)local_1d0 + lVar102 + lVar55;
        lVar103 = (long)((iVar32 + 1) - iVar95) * lVar22 * 8;
        local_4b0 = (long)local_1d0 + lVar103 + lVar55;
        local_4d8 = (long)local_1d0 + lVar102 + lVar108;
        local_498 = (double *)((long)local_1d0 + lVar103 + lVar108);
        lVar103 = (long)(iVar32 - iStack_1f0) * lVar58 * 8;
        lVar102 = lVar53 + -8 + lVar103;
        lVar76 = (long)pdVar27 + lVar43 * lVar102 + lVar39;
        lVar90 = (long)((iVar32 + 1) - iStack_1f0) * lVar58 * 8;
        lVar73 = (long)pdVar27 + (lVar53 + -8 + lVar90) * lVar43 + lVar39;
        lVar103 = lVar103 + lVar53;
        lVar98 = (long)pdVar27 + lVar43 * lVar103 + lVar39;
        lVar91 = (long)pdVar27 + (lVar90 + lVar53) * lVar43 + lVar39;
        lVar72 = (long)pdVar25 + lVar103 * lVar42 + lVar39 + 8;
        lVar90 = (long)pdVar25 + lVar102 * lVar42 + lVar39 + 8;
        lVar103 = (long)pdVar23 +
                  lVar82 + lVar93 + (lVar81 - lVar62) * lVar24 * 8 + lVar101 * -8 + 8;
        lVar82 = (long)pdVar23 + lVar82 + lVar93 + (lVar66 - lVar62) * lVar24 * 8 + lVar101 * -8 + 8
        ;
        lVar102 = ((long)(iVar32 - iVar77) * lVar36 * 8 + lVar81 * 8 + lVar89 * -8) * lVar35;
        lVar94 = (long)p + lVar102 + ((lVar47 * lVar48 * 0x10 + lVar109 * 8) * lVar74 + lVar109 * 8)
                                     * lVar34 + lVar65 * 8 + lVar64 * -8;
        lVar88 = (long)p + lVar102 + (lVar47 * lVar48 * lVar74 * 0x10 + lVar109 * 8) * lVar34 +
                                     lVar65 * 8 + lVar64 * -8;
        lVar102 = lVar81;
        iVar31 = ~uVar10 + iVar107;
        do {
          if (iVar69 <= iVar83) {
            lVar112 = 0;
            do {
              dVar118 = (*(double *)(lVar73 + lVar112 * 8) - *(double *)(lVar76 + lVar112 * 8)) *
                        (*(double *)(local_4d8 + lVar112 * 8) +
                        *(double *)((long)local_498 + lVar112 * 8)) * dVar117 +
                        *(double *)(lVar88 + lVar112 * 8) +
                        (*(double *)(lVar90 + lVar112 * 8) - *(double *)(lVar90 + -8 + lVar112 * 8))
                        * (*(double *)(lVar82 + -8 + lVar112 * 8) +
                          *(double *)(lVar82 + lVar112 * 8)) * dVar119;
              dVar121 = (*(double *)(lVar91 + lVar112 * 8) - *(double *)(lVar98 + lVar112 * 8)) *
                        (*(double *)(local_418 + lVar112 * 8) + *(double *)(local_4b0 + lVar112 * 8)
                        ) * dVar117 +
                        *(double *)(lVar94 + lVar112 * 8) +
                        (*(double *)(lVar72 + lVar112 * 8) - *(double *)(lVar72 + -8 + lVar112 * 8))
                        * (*(double *)(lVar103 + -8 + lVar112 * 8) +
                          *(double *)(lVar103 + lVar112 * 8)) * dVar119;
              if (!l_use_forces_in_trans) {
                dVar118 = dVar118 + *(double *)(local_388 + lVar112 * 8) * l_dt * 0.5;
                dVar121 = dVar121 + *(double *)(local_3c8 + lVar112 * 8) * l_dt * 0.5;
              }
              iVar45 = pbc[1].bc[4];
              if (lVar102 == lVar61) {
                dVar120 = dVar121;
                switch(pbc[1].bc[1]) {
                case 1:
                  dVar118 = dVar121;
                  break;
                case 2:
                case 4:
                  dVar118 = 0.0;
                  dVar120 = 0.0;
                  if (dVar121 <= 0.0) {
                    dVar118 = dVar121;
                    dVar120 = dVar121;
                  }
                  break;
                case 3:
                  dVar118 = *(double *)
                             ((long)pdVar18 +
                             lVar112 * 8 +
                             (long)iVar31 * lVar19 * 8 + lVar106 + lVar67 + lVar50 * -8);
                  dVar120 = dVar118;
                  break;
                case -1:
                  dVar118 = 0.0;
                  dVar120 = 0.0;
                }
                dVar122 = dVar118;
                dVar121 = dVar120;
                if (lVar102 == lVar33 + 1) goto switchD_003a75d7_caseD_0;
              }
              else {
                dVar122 = dVar118;
                if (lVar102 == lVar33 + 1) {
                  switch(iVar45) {
                  case 1:
                  case 2:
                  case 4:
                    dVar121 = dVar118;
                  default:
switchD_003a75d7_caseD_0:
                    if (((iVar45 == 4) || (dVar122 = dVar118, iVar45 == 2)) &&
                       (dVar122 = 0.0, dVar121 = 0.0, 0.0 <= dVar118)) {
                      dVar122 = dVar118;
                      dVar121 = dVar118;
                    }
                    break;
                  case 3:
                    dVar122 = *(double *)(local_420 + lVar112 * 8);
                    dVar121 = dVar122;
                    break;
                  case -1:
                    dVar122 = 0.0;
                    dVar121 = 0.0;
                  }
                }
              }
              if (((dVar122 <= 0.0) && (0.0 <= dVar121)) || (ABS(dVar121 + dVar122) < 1e-08)) {
                uVar116 = 0;
              }
              else {
                uVar116 = -(ulong)(0.0 <= dVar121 + dVar122);
                uVar116 = ~uVar116 & (ulong)dVar121 | (ulong)dVar122 & uVar116;
              }
              *(ulong *)(local_4c8 + lVar112 * 8) = uVar116;
              lVar112 = lVar112 + 1;
            } while ((iVar83 - iVar69) + 1 != (int)lVar112);
          }
          lVar102 = lVar102 + 1;
          iVar31 = iVar31 + 1;
          local_420 = local_420 + lVar19 * 8;
          local_4c8 = local_4c8 + lVar87 * 8;
          local_3c8 = local_3c8 + lVar38 * 8;
          local_388 = local_388 + lVar38 * 8;
          local_418 = local_418 + lVar44;
          local_4b0 = local_4b0 + lVar44;
          local_4d8 = local_4d8 + lVar44;
          local_498 = (double *)((long)local_498 + lVar44);
          lVar76 = lVar76 + lVar54;
          lVar73 = lVar73 + lVar54;
          lVar98 = lVar98 + lVar54;
          lVar91 = lVar91 + lVar54;
          lVar72 = lVar72 + lVar41;
          lVar90 = lVar90 + lVar41;
          lVar103 = lVar103 + lVar24 * 8;
          lVar82 = lVar82 + lVar24 * 8;
          lVar94 = lVar94 + lVar79;
          lVar88 = lVar88 + lVar79;
        } while (iVar12 + 1 != (int)lVar102);
      }
      iVar32 = iVar32 + 1;
    } while (iVar32 != iVar100 + 1);
  }
  uVar28 = *(undefined8 *)(local_78->smallend).vect;
  uVar29 = *(undefined8 *)((local_78->smallend).vect + 2);
  aiStack_1ec[1] = (int)((ulong)*(undefined8 *)(local_78->bigend).vect >> 0x20);
  uStack_1e4 = *(undefined8 *)((local_78->bigend).vect + 2);
  iStack_1f0 = (int)uVar29;
  aiStack_1ec[0] = (int)((ulong)uVar29 >> 0x20);
  lVar44 = 0;
  do {
    if ((uStack_1e4._4_4_ >> ((uint)lVar44 & 0x1f) & 1) != 0) {
      aiStack_1ec[lVar44] = aiStack_1ec[lVar44] + -1;
    }
    lVar44 = lVar44 + 1;
  } while (lVar44 != 3);
  uStack_1e4._0_4_ = (int)uStack_1e4 + 1;
  local_1f8 = (int)uVar28;
  lVar93 = (long)local_1f8;
  iStack_1f4 = (int)((ulong)uVar28 >> 0x20);
  lVar58 = (long)iStack_1f4;
  iVar83 = aiStack_1ec[1] + 1;
  iVar92 = (aiStack_1ec[0] - local_1f8) + 2;
  pdVar26 = Ipz->p;
  iVar95 = aiStack_1ec[0] + 1;
  lVar52 = (long)(iVar95 - local_1f8);
  lVar42 = (long)((aiStack_1ec[1] + 2) - iStack_1f4);
  pdVar27 = v_ad->p;
  lVar43 = v_ad->jstride;
  lVar22 = v_ad->kstride;
  lVar66 = (long)(v_ad->begin).x;
  lVar67 = (long)(v_ad->begin).y;
  lVar44 = (long)(v_ad->begin).z;
  iVar32 = iStack_1f0 + -1;
  lVar41 = (long)iVar92;
  if (iVar32 <= (int)uStack_1e4) {
    dVar117 = -l_dt / (local_178 * 3.0);
    dVar119 = l_dt / (local_178 * 3.0);
    lVar80 = lVar93 * 8;
    lVar108 = lVar80 + lVar85 * -8;
    lVar39 = lVar21 * 0x10;
    lVar65 = -lVar44;
    lVar87 = lVar24 * 8;
    iVar100 = iVar32;
    do {
      if (iStack_1f4 <= aiStack_1ec[1]) {
        lVar54 = (long)iVar100;
        lVar109 = (int)(iVar100 - uVar11) * lVar20;
        lVar79 = (lVar65 + lVar54) * lVar22 + lVar93;
        lVar55 = (lVar54 - local_138) * local_a0 + lVar93;
        lVar53 = lVar58;
        do {
          if (local_1f8 <= iVar95) {
            lVar81 = (lVar53 - lVar51) * lVar19;
            lVar102 = 0;
            do {
              dVar118 = pdVar27[(((lVar53 + 1) - lVar67) * lVar43 + lVar79 + lVar102 + -1) - lVar66]
              ;
              dVar121 = (pdVar27 +
                        ((((lVar53 + 1) - lVar67) * lVar43 + lVar79 + lVar102 + -1) - lVar66))[1];
              dVar122 = pdVar27[((lVar53 - lVar67) * lVar43 + lVar79 + lVar102 + -1) - lVar66];
              dVar120 = (pdVar27 + (((lVar53 - lVar67) * lVar43 + lVar79 + lVar102 + -1) - lVar66))
                        [1];
              dVar118 = *(double *)
                         ((long)p +
                         lVar102 * 8 +
                         ((lVar34 * 0x10 + local_168 * -8 + lVar54 * 8) * lVar48 + lVar63 * -8 +
                         lVar53 * 8) * lVar47 + lVar108) +
                        (dVar118 - dVar122) *
                        pdVar18[(lVar21 * 2 +
                                lVar81 + (-lVar37 + lVar54) * lVar20 + lVar93 + lVar102 + -1) -
                                lVar50] * dVar119 +
                        (local_e0[(local_80 * 2 +
                                  ((lVar53 + 1) - local_1a8) * local_98 + lVar55 + lVar102 + -1) -
                                  local_e8] * dVar118 -
                        local_e0[(local_80 * 2 +
                                 (lVar53 - local_1a8) * local_98 + lVar55 + lVar102 + -1) - local_e8
                                ] * dVar122) * dVar117 + 0.0;
              dVar121 = *(double *)
                         ((long)p +
                         lVar102 * 8 +
                         (lVar53 - lVar63) * lVar47 * 8 +
                         ((-local_168 + lVar54) * lVar47 * 8 +
                         (local_d8 * 0x10 + lVar47 * lVar74 * 8 + lVar85 * -0x10) * lVar34) * lVar48
                         + lVar108) +
                        (dVar121 - dVar120) *
                        (pdVar18 +
                        ((lVar21 * 2 + lVar81 + (-lVar37 + lVar54) * lVar20 + lVar93 + lVar102 + -1)
                        - lVar50))[1] * dVar119 +
                        ((local_e0 +
                         ((local_80 * 2 +
                          ((lVar53 + 1) - local_1a8) * local_98 + lVar55 + lVar102 + -1) - local_e8)
                         )[1] * dVar121 -
                        (local_e0 +
                        ((local_80 * 2 + (lVar53 - local_1a8) * local_98 + lVar55 + lVar102 + -1) -
                        local_e8))[1] * dVar120) * dVar117 + 0.0;
              if (lVar60 < lVar93 + lVar102) {
                if (lVar46 < lVar93 + lVar102) {
                  switch(pbc[2].bc[3]) {
                  case 1:
                  case 2:
                  case 4:
                    dVar121 = dVar118;
                    break;
                  case 3:
                    dVar121 = pdVar18[lVar81 + (long)(int)((iVar84 - uVar9) + 1) +
                                               lVar109 + lVar21 * 2];
                    break;
                  case -1:
                    goto switchD_003a7e5a_caseD_ffffffff;
                  }
                }
              }
              else {
                switch(pbc[2].bc[0]) {
                case 1:
                case 2:
                case 4:
                  dVar118 = dVar121;
                  break;
                case 3:
                  dVar118 = pdVar18[lVar81 + (long)(int)(~uVar9 + iVar3) + lVar109 + lVar21 * 2];
                  break;
                case -1:
switchD_003a7e5a_caseD_ffffffff:
                  dVar121 = 0.0;
                  dVar118 = 0.0;
                }
              }
              dVar122 = *(double *)
                         ((long)pdVar23 +
                         lVar102 * 8 +
                         (lVar53 - lVar62) * lVar87 +
                         (-local_1b8 + lVar54) * local_1c0 * 8 + lVar80 + lVar101 * -8);
              uVar116 = -(ulong)(0.0 <= dVar122);
              dVar122 = (double)(~-(ulong)(ABS(dVar122) < 1e-08) & 0x3ff0000000000000);
              *(double *)
               ((long)pdVar25 +
               lVar102 * 8 +
               ((-(long)iVar32 + lVar54) * (long)(iVar83 - iStack_1f4) * 8 + lVar58 * -8 +
               lVar53 * 8) * lVar41) =
                   dVar122 * (double)(~uVar116 & (ulong)dVar121 | uVar116 & (ulong)dVar118) +
                   (dVar121 + dVar118) * (1.0 - dVar122) * 0.5;
              lVar102 = lVar102 + 1;
            } while (iVar92 != (int)lVar102);
          }
          lVar53 = lVar53 + 1;
        } while (iVar83 != (int)lVar53);
      }
      bVar113 = iVar100 != (int)uStack_1e4;
      iVar100 = iVar100 + 1;
    } while (bVar113);
    lVar60 = lVar58 + -1;
    dVar117 = -l_dt / (local_180 * 3.0);
    dVar119 = l_dt / (local_180 * 3.0);
    lVar46 = lVar35 * lVar36 * 0x10;
    lVar49 = lVar49 * 8 + lVar64 * -8;
    iVar3 = iVar32;
    do {
      if (iStack_1f4 <= iVar83) {
        lVar53 = (long)iVar3;
        pdVar96 = (double *)((-(long)iVar32 + lVar53) * lVar42 * lVar52 * 8 + (long)pdVar26);
        lVar81 = (long)pdVar27 +
                 (lVar65 + lVar53) * lVar22 * 8 +
                 lVar80 + (lVar58 - lVar67) * lVar43 * 8 + lVar66 * -8;
        lVar102 = (-lVar37 + lVar53) * lVar20 * 8;
        lVar85 = (long)pdVar18 +
                 lVar102 + lVar39 + (lVar58 - lVar51) * lVar19 * 8 + lVar93 * 8 + lVar50 * -8;
        lVar103 = (long)pdVar18 +
                  lVar102 + lVar39 + (lVar60 - lVar51) * lVar19 * 8 + lVar93 * 8 + lVar50 * -8;
        lVar54 = (-local_1b8 + lVar53) * local_1c0 * 8;
        lVar108 = (long)pdVar23 +
                  lVar54 + lVar80 + (lVar58 - lVar62) * lVar24 * 8 + lVar101 * -8 + 8;
        lVar106 = (long)pdVar23 +
                  lVar54 + lVar80 + (lVar60 - lVar62) * lVar24 * 8 + lVar101 * -8 + 8;
        lVar54 = (lVar53 - local_130) * local_128 * 8;
        lVar109 = (long)local_b8 +
                  lVar54 + local_c8 * 0x10 + (lVar58 - local_d0) * local_160 * 8 + lVar93 * 8 +
                           local_c0 * -8 + 8;
        lVar79 = (long)local_b8 +
                 lVar54 + local_c8 * 0x10 + (lVar60 - local_d0) * local_160 * 8 + lVar93 * 8 +
                          local_c0 * -8 + 8;
        lVar54 = ((lVar53 + -local_168) * lVar36 * 8 + lVar58 * 8 + lVar89 * -8) * lVar35;
        lVar53 = (long)p + lVar54 + ((lVar47 * lVar48 * 0x10 + lVar35 * lVar36 * 8) * lVar74 +
                                    lVar46) * lVar34 + lVar93 * 8 + lVar64 * -8;
        lVar55 = (long)p + lVar54 + (lVar47 * lVar48 * lVar74 * 0x10 + lVar46) * lVar34 + lVar93 * 8
                                    + lVar64 * -8;
        lVar54 = lVar58;
        do {
          if (local_1f8 <= aiStack_1ec[0]) {
            lVar73 = 0;
            do {
              dVar118 = *(double *)(lVar106 + -8 + lVar73 * 8);
              dVar121 = *(double *)(lVar106 + lVar73 * 8);
              dVar122 = *(double *)(lVar108 + -8 + lVar73 * 8);
              dVar120 = *(double *)(lVar108 + lVar73 * 8);
              dVar118 = *(double *)(lVar55 + lVar73 * 8) +
                        (dVar121 - dVar118) * *(double *)(lVar103 + lVar73 * 8) * dVar119 +
                        (*(double *)(lVar79 + lVar73 * 8) * dVar121 -
                        *(double *)(lVar79 + -8 + lVar73 * 8) * dVar118) * dVar117 + 0.0;
              dVar121 = *(double *)(lVar53 + lVar73 * 8) +
                        (dVar120 - dVar122) * *(double *)(lVar85 + lVar73 * 8) * dVar119 +
                        (*(double *)(lVar109 + lVar73 * 8) * dVar120 -
                        *(double *)(lVar109 + -8 + lVar73 * 8) * dVar122) * dVar117 + 0.0;
              if (lVar61 < lVar54) {
                if (lVar33 < lVar54) {
                  switch(pbc[2].bc[4]) {
                  case 0:
                    break;
                  case 1:
                  case 2:
                  case 4:
                    dVar121 = dVar118;
                    break;
                  case 3:
                    dVar121 = *(double *)
                               ((long)pdVar18 +
                               lVar73 * 8 +
                               lVar102 + lVar39 + (int)((iVar8 - uVar10) + 1) * lVar19 * 8 +
                                         lVar93 * 8 + lVar50 * -8);
                    break;
                  case -1:
                    dVar118 = 0.0;
                    dVar121 = 0.0;
                    break;
                  default:
                    goto switchD_003a84e6_default;
                  }
                }
              }
              else {
                switch(pbc[2].bc[1]) {
                case 1:
                case 2:
                case 4:
                  dVar118 = dVar121;
                  break;
                case 3:
                  dVar118 = *(double *)
                             ((long)pdVar18 +
                             lVar73 * 8 +
                             lVar102 + lVar39 + (int)(~uVar10 + iVar4) * lVar19 * 8 + lVar93 * 8 +
                                       lVar50 * -8);
                  break;
                case -1:
                  dVar118 = 0.0;
                  dVar121 = 0.0;
                }
              }
switchD_003a84e6_default:
              dVar122 = *(double *)(lVar81 + lVar73 * 8);
              uVar116 = -(ulong)(0.0 <= dVar122);
              dVar122 = (double)(~-(ulong)(ABS(dVar122) < 1e-08) & 0x3ff0000000000000);
              pdVar96[lVar73] =
                   dVar122 * (double)(~uVar116 & (ulong)dVar121 | uVar116 & (ulong)dVar118) +
                   (dVar121 + dVar118) * (1.0 - dVar122) * 0.5;
              lVar73 = lVar73 + 1;
            } while (iVar95 - local_1f8 != (int)lVar73);
          }
          lVar54 = lVar54 + 1;
          pdVar96 = pdVar96 + (iVar95 - lVar93);
          lVar81 = lVar81 + lVar43 * 8;
          lVar85 = lVar85 + lVar19 * 8;
          lVar103 = lVar103 + lVar19 * 8;
          lVar108 = lVar108 + lVar87;
          lVar106 = lVar106 + lVar87;
          lVar109 = lVar109 + local_160 * 8;
          lVar79 = lVar79 + local_160 * 8;
          lVar53 = lVar53 + lVar49;
          lVar55 = lVar55 + lVar49;
        } while (aiStack_1ec[1] + 2 != (int)lVar54);
      }
      bVar113 = iVar3 != (int)uStack_1e4;
      iVar3 = iVar3 + 1;
    } while (bVar113);
  }
  iVar3 = (local_78->smallend).vect[2];
  iVar4 = (local_78->bigend).vect[2];
  if (iVar3 <= iVar4) {
    iVar8 = (local_78->smallend).vect[0];
    lVar80 = (long)iVar8;
    lVar49 = lVar21 * 0x10 + lVar80 * 8 + lVar50 * -8;
    iVar95 = (qz->begin).x;
    lVar61 = lVar80 * 8;
    lVar85 = lVar56 * 0x10 + lVar80 * 8 + lVar40 * -8;
    lVar89 = lVar61 + lVar66 * -8;
    lVar50 = lVar61 + lVar93 * -8;
    iStack_1f0 = iVar3 - iStack_1f0;
    lVar60 = lVar80 * 8 + 8;
    lVar56 = lVar60 + lVar93 * -8;
    lVar60 = lVar60 + lVar101 * -8;
    lVar46 = qz->jstride;
    lVar21 = qz->kstride;
    iVar100 = (qz->begin).z;
    pdVar96 = qz->p;
    iVar107 = (qz->begin).y;
    lVar34 = (lVar36 * lVar35 * 0x10 + lVar47 * lVar48 * 0x10) * lVar34;
    iVar69 = (local_78->bigend).vect[0];
    iVar78 = (local_78->bigend).vect[1];
    iVar104 = (local_78->smallend).vect[1];
    dVar119 = (l_dt * -0.25) / local_180;
    dVar117 = (l_dt * -0.25) / local_178;
    iVar84 = iVar3 + -1;
    iVar92 = iVar84 - uVar11;
    lVar97 = lVar97 * 8;
    lVar33 = -(long)iVar59;
    lVar44 = -lVar44;
    lVar47 = lVar58 * -8 + 8;
    lVar42 = lVar42 * 8;
    lVar58 = lVar58 * -8;
    lVar36 = (long)(iVar83 - iStack_1f4) * 8;
    do {
      if (iVar104 <= iVar78) {
        lVar39 = (long)iVar3;
        lVar65 = (long)iVar84;
        lVar93 = lVar42 * (lVar39 - iVar32);
        lVar87 = lVar42 * iStack_1f0;
        lVar101 = (lVar44 + lVar39) * lVar22 * 8 + lVar89;
        lVar40 = (lVar44 + lVar65) * lVar22 * 8 + lVar89;
        lVar66 = (long)iVar104;
        do {
          if (iVar8 <= iVar69) {
            lVar109 = (lVar66 - lVar62) * lVar24 * 8;
            lVar81 = (lVar66 - lVar57) * lVar38 * 8;
            lVar102 = (lVar66 - lVar51) * lVar19 * 8;
            lVar106 = (lVar66 - lVar67) * lVar43 * 8;
            lVar103 = ((lVar66 + 1) - lVar67) * lVar43 * 8;
            lVar108 = ((lVar39 - iVar32) * lVar36 + lVar58 + lVar66 * 8) * lVar41 + lVar56;
            lVar53 = (iStack_1f0 * lVar36 + lVar58 + lVar66 * 8) * lVar41 + lVar56;
            lVar54 = lVar109 + (-local_1b8 + lVar39) * local_1c0 * 8 + lVar60;
            lVar109 = lVar109 + (lVar65 + -local_1b8) * local_1c0 * 8 + lVar60;
            lVar79 = ((local_1a0 * 0x10 + local_158 * -8 + lVar39 * 8) * lVar48 + lVar63 * -8 +
                     lVar66 * 8) * lVar35;
            lVar55 = 0;
            do {
              dVar118 = (*(double *)
                          ((long)pdVar26 +
                          lVar55 * 8 + (lVar47 + lVar87 + lVar66 * 8) * lVar52 + lVar50) -
                        *(double *)
                         ((long)pdVar26 +
                         lVar55 * 8 + (lVar87 + lVar58 + lVar66 * 8) * lVar52 + lVar50)) *
                        (*(double *)((long)pdVar27 + lVar55 * 8 + lVar106 + lVar40) +
                        *(double *)((long)pdVar27 + lVar55 * 8 + lVar103 + lVar40)) * dVar117 +
                        *(double *)
                         ((long)p + lVar55 * 8 + lVar79 + lVar34 * lVar74 + lVar80 * 8 + lVar64 * -8
                         ) + (*(double *)((long)pdVar25 + lVar55 * 8 + lVar53) -
                             *(double *)((long)pdVar25 + lVar55 * 8 + lVar53 + -8)) *
                             (*(double *)((long)pdVar23 + lVar55 * 8 + lVar109 + -8) +
                             *(double *)((long)pdVar23 + lVar55 * 8 + lVar109)) * dVar119;
              dVar121 = (*(double *)
                          ((long)pdVar26 +
                          lVar55 * 8 + (lVar47 + lVar93 + lVar66 * 8) * lVar52 + lVar50) -
                        *(double *)
                         ((long)pdVar26 +
                         lVar55 * 8 + (lVar93 + lVar58 + lVar66 * 8) * lVar52 + lVar50)) *
                        (*(double *)((long)pdVar27 + lVar55 * 8 + lVar106 + lVar101) +
                        *(double *)((long)pdVar27 + lVar55 * 8 + lVar103 + lVar101)) * dVar117 +
                        *(double *)
                         ((long)p +
                         lVar55 * 8 +
                         lVar79 + (lVar34 + lVar48 * lVar35 * local_1a0 * 8) * lVar74 + lVar80 * 8 +
                                  lVar64 * -8) +
                        (*(double *)((long)pdVar25 + lVar55 * 8 + lVar108) -
                        *(double *)((long)pdVar25 + lVar55 * 8 + lVar108 + -8)) *
                        (*(double *)((long)pdVar23 + lVar55 * 8 + lVar54 + -8) +
                        *(double *)((long)pdVar23 + lVar55 * 8 + lVar54)) * dVar119;
              if (!l_use_forces_in_trans) {
                dVar118 = dVar118 + *(double *)
                                     ((long)pdVar75 +
                                     lVar55 * 8 + lVar81 + (lVar33 + lVar65) * lVar97 + lVar85) *
                                    l_dt * 0.5;
                dVar121 = dVar121 + *(double *)
                                     ((long)pdVar75 +
                                     lVar55 * 8 + lVar81 + (lVar33 + lVar39) * lVar97 + lVar85) *
                                    l_dt * 0.5;
              }
              iVar59 = pbc[2].bc[5];
              dVar122 = dVar121;
              if (iVar5 == iVar3) {
                switch(pbc[2].bc[2]) {
                case 1:
                  dVar118 = dVar121;
                  break;
                case 2:
                case 4:
                  dVar118 = 0.0;
                  dVar122 = 0.0;
                  if (dVar121 <= 0.0) {
                    dVar118 = dVar121;
                    dVar122 = dVar121;
                  }
                  break;
                case 3:
                  dVar118 = *(double *)
                             ((long)pdVar18 +
                             lVar55 * 8 + lVar102 + (long)iVar92 * lVar20 * 8 + lVar49);
                  dVar122 = dVar118;
                  break;
                case -1:
                  dVar118 = 0.0;
                  dVar122 = 0.0;
                }
                dVar121 = dVar118;
                if (iVar7 + 1 == iVar3) {
LAB_003a8ee2:
                  if (((iVar59 == 4) || (dVar121 = dVar118, iVar59 == 2)) &&
                     (dVar121 = 0.0, dVar122 = 0.0, 0.0 <= dVar118)) {
                    dVar121 = dVar118;
                    dVar122 = dVar118;
                  }
                }
              }
              else {
                dVar121 = dVar118;
                if (iVar7 + 1 == iVar3) {
                  switch(iVar59) {
                  case 1:
                  case 2:
                  case 4:
                    dVar122 = dVar118;
                  default:
                    goto LAB_003a8ee2;
                  case 3:
                    dVar121 = *(double *)
                               ((long)pdVar18 +
                               lVar55 * 8 + lVar102 + (lVar39 - lVar37) * lVar20 * 8 + lVar49);
                    dVar122 = dVar121;
                    break;
                  case -1:
                    dVar121 = 0.0;
                    dVar122 = dVar121;
                  }
                }
              }
              if (((dVar121 <= 0.0) && (0.0 <= dVar122)) || (ABS(dVar122 + dVar121) < 1e-08)) {
                uVar116 = 0;
              }
              else {
                uVar116 = -(ulong)(0.0 <= dVar122 + dVar121);
                uVar116 = ~uVar116 & (ulong)dVar122 | (ulong)dVar121 & uVar116;
              }
              *(ulong *)((long)pdVar96 +
                        lVar55 * 8 +
                        (lVar66 - iVar107) * lVar46 * 8 +
                        (lVar39 - iVar100) * lVar21 * 8 + lVar61 + (long)iVar95 * -8) = uVar116;
              lVar55 = lVar55 + 1;
            } while ((iVar69 - iVar8) + 1 != (int)lVar55);
          }
          lVar66 = lVar66 + 1;
        } while (iVar78 + 1 != (int)lVar66);
      }
      iVar92 = iVar92 + 1;
      iVar84 = iVar84 + 1;
      iStack_1f0 = iStack_1f0 + 1;
      bVar113 = iVar3 != iVar4;
      iVar3 = iVar3 + 1;
    } while (bVar113);
  }
  return;
}

Assistant:

void
Godunov::ExtrapVelToFacesOnBox ( Box const& bx, int ncomp,
                                 Box const& xbx,
                                 Box const& ybx,
                                 Box const& zbx,
                                 Array4<Real> const& qx,
                                 Array4<Real> const& qy,
                                 Array4<Real> const& qz,
                                 Array4<Real const> const& q,
                                 Array4<Real const> const& u_ad,
                                 Array4<Real const> const& v_ad,
                                 Array4<Real const> const& w_ad,
                                 Array4<Real> const& Imx,
                                 Array4<Real> const& Imy,
                                 Array4<Real> const& Imz,
                                 Array4<Real> const& Ipx,
                                 Array4<Real> const& Ipy,
                                 Array4<Real> const& Ipz,
                                 Array4<Real const> const& f,
                                 const Box& domain,
                                 const Real* dx_arr,
                                 Real l_dt,
                                 BCRec  const* pbc,
                                 bool l_use_forces_in_trans,
                                 Real* p)
{

    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    Real dx = dx_arr[0];
    Real dy = dx_arr[1];
    Real dz = dx_arr[2];

    Box xebox = Box(bx).grow(1,1).grow(2,1).surroundingNodes(0);
    Box yebox = Box(bx).grow(0,1).grow(2,1).surroundingNodes(1);
    Box zebox = Box(bx).grow(0,1).grow(1,1).surroundingNodes(2);

    Array4<Real> xlo = makeArray4(p, xebox, ncomp);
    p += xlo.size();
    Array4<Real> xhi = makeArray4(p, xebox, ncomp);
    p += xhi.size();
    Array4<Real> ylo = makeArray4(p, yebox, ncomp);
    p += ylo.size();
    Array4<Real> yhi = makeArray4(p, yebox, ncomp);
    p += yhi.size();
    Array4<Real> zlo = makeArray4(p, zebox, ncomp);
    p += zlo.size();
    Array4<Real> zhi = makeArray4(p, zebox, ncomp);
    p += zhi.size();

    amrex::ParallelFor(
    xebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        Real lo = Ipx(i-1,j,k,n);
        Real hi = Imx(i  ,j,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i-1,j,k,n);
            hi += 0.5*l_dt*f(i  ,j,k,n);
        }

        Real uad = u_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, lo, hi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);

        xlo(i,j,k,n) = lo;
        xhi(i,j,k,n) = hi;

        Real st = (uad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        Imx(i, j, k, n) = fu*st + (1.0 - fu) *0.5 * (hi + lo); // store xedge
    },
    yebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        Real lo = Ipy(i,j-1,k,n);
        Real hi = Imy(i,j  ,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j-1,k,n);
            hi += 0.5*l_dt*f(i,j  ,k,n);
        }

        Real vad = v_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, lo, hi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        ylo(i,j,k,n) = lo;
        yhi(i,j,k,n) = hi;

        Real st = (vad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        Imy(i, j, k, n) = fu*st + (1.0 - fu)*0.5*(hi + lo); // store yedge
    },
    zebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {

        Real lo = Ipz(i,j,k-1,n);
        Real hi = Imz(i,j,k  ,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j,k-1,n);
            hi += 0.5*l_dt*f(i,j,k  ,n);
        }

        Real wad = w_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, lo, hi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        zlo(i,j,k,n) = lo;
        zhi(i,j,k,n) = hi;

        Real st = (wad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        Imz(i, j, k, n) = fu*st + (1.0 - fu)*0.5*(hi + lo); // store zedge
    }
    );


    Array4<Real> xedge = Imx;
    Array4<Real> yedge = Imy;
    Array4<Real> zedge = Imz;

    Array4<Real> divu = makeArray4(Ipx.dataPtr(), grow(bx,1), 1);
    amrex::ParallelFor(Box(divu), [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept {
        divu(i,j,k) = 0.0;
    });

    //
    // X-Flux
    //
    Box const xbxtmp = Box(xbx).enclosedCells().grow(0,1);
    Array4<Real> yzlo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(xbxtmp,1), 1);
    Array4<Real> zylo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(xbxtmp,2), 1);

    // Add d/dy term to z-faces
    // Start with {zlo,zhi} --> {zylo, zyhi} and upwind using w_ad to {zylo}
    // Add d/dz to y-faces
    // Start with {ylo,yhi} --> {yzlo, yzhi} and upwind using v_ad to {yzlo}
    amrex::ParallelFor(Box(zylo), Box(yzlo),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        const auto bc = pbc[n];
        Real l_zylo, l_zyhi;
        GodunovCornerCouple::AddCornerCoupleTermZY(l_zylo, l_zyhi,
                              i, j, k, n, l_dt, dy, false,
                              zlo(i,j,k,n), zhi(i,j,k,n),
                              q, divu, v_ad, yedge);

        Real wad = w_ad(i,j,k);
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, l_zylo, l_zyhi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);


        Real st = (wad >= 0.) ? l_zylo : l_zyhi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        zylo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_zyhi + l_zylo);
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        const auto bc = pbc[n];
        Real l_yzlo, l_yzhi;
        GodunovCornerCouple::AddCornerCoupleTermYZ(l_yzlo, l_yzhi,
                              i, j, k, n, l_dt, dz, false,
                              ylo(i,j,k,n), yhi(i,j,k,n),
                              q, divu, w_ad, zedge);

        Real vad = v_ad(i,j,k);
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, l_yzlo, l_yzhi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        Real st = (vad >= 0.) ? l_yzlo : l_yzhi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        yzlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_yzhi + l_yzlo);
    });

    //
    amrex::ParallelFor(xbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        auto bc = pbc[n];

        Real stl = xlo(i,j,k,n) - (0.25*l_dt/dy)*(v_ad(i-1,j+1,k  )+v_ad(i-1,j,k))*
                                                 (yzlo(i-1,j+1,k  )-yzlo(i-1,j,k))
                                - (0.25*l_dt/dz)*(w_ad(i-1,j  ,k+1)+w_ad(i-1,j,k))*
                                                 (zylo(i-1,j  ,k+1)-zylo(i-1,j,k));
        Real sth = xhi(i,j,k,n) - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k  )+v_ad(i  ,j,k))*
                                                 (yzlo(i  ,j+1,k  )-yzlo(i  ,j,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j  ,k+1)+w_ad(i  ,j,k))*
                                                 (zylo(i  ,j  ,k+1)-zylo(i  ,j,k));

        if (!l_use_forces_in_trans)
        {
            stl += 0.5 * l_dt * f(i-1,j,k,n);
            sth += 0.5 * l_dt * f(i  ,j,k,n);
        }

        HydroBC::SetXEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(0), dlo.x, bc.hi(0), dhi.x, true);

        if ( (i==dlo.x) && (bc.lo(0) == BCType::foextrap || bc.lo(0) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (i==dhi.x+1) && (bc.hi(0) == BCType::foextrap || bc.hi(0) == BCType::hoextrap) )
        {
             stl = amrex::max(stl,0.0_rt);
             sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qx(i,j,k) = ltm ? 0. : st;
    });

    //
    // Y-Flux
    //
    Box const ybxtmp = Box(ybx).enclosedCells().grow(1,1);
    Array4<Real> xzlo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(ybxtmp,0), 1);
    Array4<Real> zxlo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(ybxtmp,2), 1);

    // Add d/dz to x-faces
    // Start with {xlo,xhi} --> {xzlo, xzhi} and upwind using u_ad to {xzlo}
    // Add d/dx term to z-faces
    // Start with {zlo,zhi} --> {zxlo, zxhi} and upwind using w_ad to {zxlo}
    amrex::ParallelFor(Box(xzlo), Box(zxlo),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        const auto bc = pbc[n];
        Real l_xzlo, l_xzhi;
        GodunovCornerCouple::AddCornerCoupleTermXZ(l_xzlo, l_xzhi,
                              i, j, k, n, l_dt, dz, false,
                              xlo(i,j,k,n),  xhi(i,j,k,n),
                              q, divu, w_ad, zedge);

        Real uad = u_ad(i,j,k);
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, l_xzlo, l_xzhi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);


        Real st = (uad >= 0.) ? l_xzlo : l_xzhi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        xzlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_xzhi + l_xzlo);
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        const auto bc = pbc[n];
        Real l_zxlo, l_zxhi;
        GodunovCornerCouple::AddCornerCoupleTermZX(l_zxlo, l_zxhi,
                              i, j, k, n, l_dt, dx, false,
                              zlo(i,j,k,n), zhi(i,j,k,n),
                              q, divu, u_ad, xedge);

        Real wad = w_ad(i,j,k);
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, l_zxlo, l_zxhi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        Real st = (wad >= 0.) ? l_zxlo : l_zxhi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        zxlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_zxhi + l_zxlo);
    });

    //
    amrex::ParallelFor(ybx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        auto bc = pbc[n];

        Real stl = ylo(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j-1,k  )+u_ad(i,j-1,k))*
                                                 (xzlo(i+1,j-1,k  )-xzlo(i,j-1,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j-1,k+1)+w_ad(i,j-1,k))*
                                                 (zxlo(i  ,j-1,k+1)-zxlo(i,j-1,k));
        Real sth = yhi(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k  )+u_ad(i,j  ,k))*
                                                 (xzlo(i+1,j  ,k  )-xzlo(i,j  ,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j  ,k+1)+w_ad(i,j  ,k))*
                                                 (zxlo(i  ,j  ,k+1)-zxlo(i,j  ,k));


        if (!l_use_forces_in_trans)
        {
           stl += 0.5 * l_dt * f(i,j-1,k,n);
           sth += 0.5 * l_dt * f(i,j  ,k,n);
        }

        HydroBC::SetYEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(1), dlo.y, bc.hi(1), dhi.y, true);

        if ( (j==dlo.y) && (bc.lo(1) == BCType::foextrap || bc.lo(1) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (j==dhi.y+1) && (bc.hi(1) == BCType::foextrap || bc.hi(1) == BCType::hoextrap) )
        {
            stl = amrex::max(stl,0.0_rt);
            sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qy(i,j,k) = ltm ? 0. : st;
    });


    //
    // Z-Flux
    //
    Box const zbxtmp = Box(zbx).enclosedCells().grow(2,1);
    Array4<Real> xylo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(zbxtmp,0), 1);
    Array4<Real> yxlo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(zbxtmp,1), 1);

    amrex::ParallelFor(Box(xylo), Box(yxlo),
    //
    // Add d/dy term to x-faces
    // Start with {xlo,xhi} --> {xylo, xyhi} and upwind using u_ad to {xylo}
    //
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        const auto bc = pbc[n];
        Real l_xylo, l_xyhi;
        GodunovCornerCouple::AddCornerCoupleTermXY(l_xylo, l_xyhi,
                              i, j, k, n, l_dt, dy, false,
                              xlo(i,j,k,n), xhi(i,j,k,n),
                              q, divu, v_ad, yedge);

        Real uad = u_ad(i,j,k);
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, l_xylo, l_xyhi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);


        Real st = (uad >= 0.) ? l_xylo : l_xyhi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        xylo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_xyhi + l_xylo);
    },
    //
    // Add d/dx term to y-faces
    // Start with {ylo,yhi} --> {yxlo, yxhi} and upwind using v_ad to {yxlo}
    //
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        const auto bc = pbc[n];
        Real l_yxlo, l_yxhi;
        GodunovCornerCouple::AddCornerCoupleTermYX(l_yxlo, l_yxhi,
                              i, j, k, n, l_dt, dx, false,
                              ylo(i,j,k,n), yhi(i,j,k,n),
                              q, divu, u_ad, xedge);

        Real vad = v_ad(i,j,k);
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, l_yxlo, l_yxhi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);


        Real st = (vad >= 0.) ? l_yxlo : l_yxhi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        yxlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_yxhi + l_yxlo);
    });
    //
    amrex::ParallelFor(zbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        auto bc = pbc[n];
        Real stl = zlo(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k-1)+u_ad(i,j,k-1))*
                                                 (xylo(i+1,j  ,k-1)-xylo(i,j,k-1))
                                - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k-1)+v_ad(i,j,k-1))*
                                                 (yxlo(i  ,j+1,k-1)-yxlo(i,j,k-1));
        Real sth = zhi(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k  )+u_ad(i,j,k  ))*
                                                 (xylo(i+1,j  ,k  )-xylo(i,j,k  ))
                                - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k  )+v_ad(i,j,k  ))*
                                                 (yxlo(i  ,j+1,k  )-yxlo(i,j,k  ));

        if (!l_use_forces_in_trans)
        {
           stl += 0.5 * l_dt * f(i,j,k-1,n);
           sth += 0.5 * l_dt * f(i,j,k  ,n);
        }

        HydroBC::SetZEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(2), dlo.z, bc.hi(2), dhi.z, true);

        if ( (k==dlo.z) && (bc.lo(2) == BCType::foextrap || bc.lo(2) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (k==dhi.z+1) && (bc.hi(2) == BCType::foextrap || bc.hi(2) == BCType::hoextrap) )
        {
            stl = amrex::max(stl,0.0_rt);
            sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qz(i,j,k) = ltm ? 0. : st;
    });
}